

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  bool bVar63;
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  bool bVar79;
  uint uVar80;
  ulong uVar81;
  long lVar82;
  uint uVar83;
  uint uVar85;
  long lVar86;
  ulong uVar87;
  ulong uVar88;
  bool bVar89;
  float t1;
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar91 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar173;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar177;
  float fVar193;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar190;
  float fVar192;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar191;
  float fVar194;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar198;
  float fVar217;
  float fVar218;
  undefined1 auVar199 [16];
  float fVar219;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar234;
  float fVar236;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar225 [16];
  undefined1 auVar232 [32];
  float fVar235;
  undefined1 auVar233 [32];
  vfloat4 b0;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  __m128 a;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar301;
  float fVar302;
  vfloat4 a0_1;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar303;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar307;
  float fVar312;
  float fVar313;
  vfloat4 a0;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar314;
  undefined1 auVar310 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float in_register_0000151c;
  undefined1 auVar311 [32];
  float fVar321;
  undefined1 auVar323 [16];
  undefined1 auVar322 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  float fVar328;
  float fVar329;
  undefined1 auVar327 [32];
  undefined1 auVar331 [16];
  float fVar330;
  undefined1 auVar332 [16];
  float fVar335;
  float fVar336;
  float in_register_0000159c;
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  float in_register_000015dc;
  undefined1 auVar345 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_711;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  uint auStack_480 [4];
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar84;
  undefined1 auVar170 [32];
  undefined1 auVar344 [32];
  
  PVar8 = prim[1];
  uVar81 = (ulong)(byte)PVar8;
  lVar86 = uVar81 * 5;
  fVar198 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar114 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar114 = vsubps_avx(auVar114,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  auVar105._0_4_ = fVar198 * auVar114._0_4_;
  auVar105._4_4_ = fVar198 * auVar114._4_4_;
  auVar105._8_4_ = fVar198 * auVar114._8_4_;
  auVar105._12_4_ = fVar198 * auVar114._12_4_;
  auVar199._0_4_ = fVar198 * auVar204._0_4_;
  auVar199._4_4_ = fVar198 * auVar204._4_4_;
  auVar199._8_4_ = fVar198 * auVar204._8_4_;
  auVar199._12_4_ = fVar198 * auVar204._12_4_;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 10)));
  auVar94._16_16_ = auVar204;
  auVar94._0_16_ = auVar114;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar86 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar86 + 10)));
  auVar138._16_16_ = auVar204;
  auVar138._0_16_ = auVar114;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 10)));
  auVar15 = vcvtdq2ps_avx(auVar138);
  auVar163._16_16_ = auVar204;
  auVar163._0_16_ = auVar114;
  auVar16 = vcvtdq2ps_avx(auVar163);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 10)));
  auVar186._16_16_ = auVar204;
  auVar186._0_16_ = auVar114;
  uVar88 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar186);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 10)));
  auVar230._16_16_ = auVar204;
  auVar230._0_16_ = auVar114;
  auVar18 = vcvtdq2ps_avx(auVar230);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + uVar81 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + uVar81 + 10)));
  auVar245._16_16_ = auVar204;
  auVar245._0_16_ = auVar114;
  auVar19 = vcvtdq2ps_avx(auVar245);
  lVar82 = uVar81 * 9;
  uVar88 = (ulong)(uint)((int)lVar82 * 2);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 10)));
  auVar261._16_16_ = auVar204;
  auVar261._0_16_ = auVar114;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + uVar81 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + uVar81 + 10)));
  auVar20 = vcvtdq2ps_avx(auVar261);
  auVar279._16_16_ = auVar204;
  auVar279._0_16_ = auVar114;
  auVar21 = vcvtdq2ps_avx(auVar279);
  uVar88 = (ulong)(uint)((int)lVar86 << 2);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 10)));
  auVar288._16_16_ = auVar204;
  auVar288._0_16_ = auVar114;
  auVar22 = vcvtdq2ps_avx(auVar288);
  auVar114 = vshufps_avx(auVar199,auVar199,0);
  auVar204 = vshufps_avx(auVar199,auVar199,0x55);
  auVar214 = vshufps_avx(auVar199,auVar199,0xaa);
  fVar198 = auVar214._0_4_;
  fVar217 = auVar214._4_4_;
  fVar218 = auVar214._8_4_;
  fVar219 = auVar214._12_4_;
  fVar220 = auVar204._0_4_;
  fVar221 = auVar204._4_4_;
  fVar222 = auVar204._8_4_;
  fVar145 = auVar204._12_4_;
  fVar171 = auVar114._0_4_;
  fVar172 = auVar114._4_4_;
  fVar173 = auVar114._8_4_;
  fVar174 = auVar114._12_4_;
  auVar311._0_4_ = fVar171 * auVar94._0_4_ + fVar220 * auVar15._0_4_ + fVar198 * auVar16._0_4_;
  auVar311._4_4_ = fVar172 * auVar94._4_4_ + fVar221 * auVar15._4_4_ + fVar217 * auVar16._4_4_;
  auVar311._8_4_ = fVar173 * auVar94._8_4_ + fVar222 * auVar15._8_4_ + fVar218 * auVar16._8_4_;
  auVar311._12_4_ = fVar174 * auVar94._12_4_ + fVar145 * auVar15._12_4_ + fVar219 * auVar16._12_4_;
  auVar311._16_4_ = fVar171 * auVar94._16_4_ + fVar220 * auVar15._16_4_ + fVar198 * auVar16._16_4_;
  auVar311._20_4_ = fVar172 * auVar94._20_4_ + fVar221 * auVar15._20_4_ + fVar217 * auVar16._20_4_;
  auVar311._24_4_ = fVar173 * auVar94._24_4_ + fVar222 * auVar15._24_4_ + fVar218 * auVar16._24_4_;
  auVar311._28_4_ = fVar145 + in_register_000015dc + in_register_0000151c;
  auVar299._0_4_ = fVar171 * auVar17._0_4_ + fVar220 * auVar18._0_4_ + fVar198 * auVar19._0_4_;
  auVar299._4_4_ = fVar172 * auVar17._4_4_ + fVar221 * auVar18._4_4_ + fVar217 * auVar19._4_4_;
  auVar299._8_4_ = fVar173 * auVar17._8_4_ + fVar222 * auVar18._8_4_ + fVar218 * auVar19._8_4_;
  auVar299._12_4_ = fVar174 * auVar17._12_4_ + fVar145 * auVar18._12_4_ + fVar219 * auVar19._12_4_;
  auVar299._16_4_ = fVar171 * auVar17._16_4_ + fVar220 * auVar18._16_4_ + fVar198 * auVar19._16_4_;
  auVar299._20_4_ = fVar172 * auVar17._20_4_ + fVar221 * auVar18._20_4_ + fVar217 * auVar19._20_4_;
  auVar299._24_4_ = fVar173 * auVar17._24_4_ + fVar222 * auVar18._24_4_ + fVar218 * auVar19._24_4_;
  auVar299._28_4_ = fVar145 + in_register_000015dc + in_register_0000159c;
  auVar216._0_4_ = fVar171 * auVar20._0_4_ + fVar220 * auVar21._0_4_ + auVar22._0_4_ * fVar198;
  auVar216._4_4_ = fVar172 * auVar20._4_4_ + fVar221 * auVar21._4_4_ + auVar22._4_4_ * fVar217;
  auVar216._8_4_ = fVar173 * auVar20._8_4_ + fVar222 * auVar21._8_4_ + auVar22._8_4_ * fVar218;
  auVar216._12_4_ = fVar174 * auVar20._12_4_ + fVar145 * auVar21._12_4_ + auVar22._12_4_ * fVar219;
  auVar216._16_4_ = fVar171 * auVar20._16_4_ + fVar220 * auVar21._16_4_ + auVar22._16_4_ * fVar198;
  auVar216._20_4_ = fVar172 * auVar20._20_4_ + fVar221 * auVar21._20_4_ + auVar22._20_4_ * fVar217;
  auVar216._24_4_ = fVar173 * auVar20._24_4_ + fVar222 * auVar21._24_4_ + auVar22._24_4_ * fVar218;
  auVar216._28_4_ = fVar174 + fVar145 + fVar219;
  auVar114 = vshufps_avx(auVar105,auVar105,0);
  auVar204 = vshufps_avx(auVar105,auVar105,0x55);
  auVar214 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar217 = auVar214._0_4_;
  fVar218 = auVar214._4_4_;
  fVar219 = auVar214._8_4_;
  fVar220 = auVar214._12_4_;
  fVar172 = auVar204._0_4_;
  fVar173 = auVar204._4_4_;
  fVar174 = auVar204._8_4_;
  fVar175 = auVar204._12_4_;
  fVar221 = auVar114._0_4_;
  fVar222 = auVar114._4_4_;
  fVar145 = auVar114._8_4_;
  fVar171 = auVar114._12_4_;
  fVar198 = auVar94._28_4_;
  auVar231._0_4_ = fVar221 * auVar94._0_4_ + fVar172 * auVar15._0_4_ + fVar217 * auVar16._0_4_;
  auVar231._4_4_ = fVar222 * auVar94._4_4_ + fVar173 * auVar15._4_4_ + fVar218 * auVar16._4_4_;
  auVar231._8_4_ = fVar145 * auVar94._8_4_ + fVar174 * auVar15._8_4_ + fVar219 * auVar16._8_4_;
  auVar231._12_4_ = fVar171 * auVar94._12_4_ + fVar175 * auVar15._12_4_ + fVar220 * auVar16._12_4_;
  auVar231._16_4_ = fVar221 * auVar94._16_4_ + fVar172 * auVar15._16_4_ + fVar217 * auVar16._16_4_;
  auVar231._20_4_ = fVar222 * auVar94._20_4_ + fVar173 * auVar15._20_4_ + fVar218 * auVar16._20_4_;
  auVar231._24_4_ = fVar145 * auVar94._24_4_ + fVar174 * auVar15._24_4_ + fVar219 * auVar16._24_4_;
  auVar231._28_4_ = fVar198 + auVar15._28_4_ + auVar16._28_4_;
  auVar139._0_4_ = fVar221 * auVar17._0_4_ + fVar172 * auVar18._0_4_ + fVar217 * auVar19._0_4_;
  auVar139._4_4_ = fVar222 * auVar17._4_4_ + fVar173 * auVar18._4_4_ + fVar218 * auVar19._4_4_;
  auVar139._8_4_ = fVar145 * auVar17._8_4_ + fVar174 * auVar18._8_4_ + fVar219 * auVar19._8_4_;
  auVar139._12_4_ = fVar171 * auVar17._12_4_ + fVar175 * auVar18._12_4_ + fVar220 * auVar19._12_4_;
  auVar139._16_4_ = fVar221 * auVar17._16_4_ + fVar172 * auVar18._16_4_ + fVar217 * auVar19._16_4_;
  auVar139._20_4_ = fVar222 * auVar17._20_4_ + fVar173 * auVar18._20_4_ + fVar218 * auVar19._20_4_;
  auVar139._24_4_ = fVar145 * auVar17._24_4_ + fVar174 * auVar18._24_4_ + fVar219 * auVar19._24_4_;
  auVar139._28_4_ = fVar198 + auVar16._28_4_ + auVar19._28_4_;
  auVar123._0_4_ = fVar221 * auVar20._0_4_ + fVar172 * auVar21._0_4_ + auVar22._0_4_ * fVar217;
  auVar123._4_4_ = fVar222 * auVar20._4_4_ + fVar173 * auVar21._4_4_ + auVar22._4_4_ * fVar218;
  auVar123._8_4_ = fVar145 * auVar20._8_4_ + fVar174 * auVar21._8_4_ + auVar22._8_4_ * fVar219;
  auVar123._12_4_ = fVar171 * auVar20._12_4_ + fVar175 * auVar21._12_4_ + auVar22._12_4_ * fVar220;
  auVar123._16_4_ = fVar221 * auVar20._16_4_ + fVar172 * auVar21._16_4_ + auVar22._16_4_ * fVar217;
  auVar123._20_4_ = fVar222 * auVar20._20_4_ + fVar173 * auVar21._20_4_ + auVar22._20_4_ * fVar218;
  auVar123._24_4_ = fVar145 * auVar20._24_4_ + fVar174 * auVar21._24_4_ + auVar22._24_4_ * fVar219;
  auVar123._28_4_ = fVar198 + auVar18._28_4_ + fVar220;
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95._16_4_ = 0x7fffffff;
  auVar95._20_4_ = 0x7fffffff;
  auVar95._24_4_ = 0x7fffffff;
  auVar95._28_4_ = 0x7fffffff;
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar164._16_4_ = 0x219392ef;
  auVar164._20_4_ = 0x219392ef;
  auVar164._24_4_ = 0x219392ef;
  auVar164._28_4_ = 0x219392ef;
  auVar94 = vandps_avx(auVar311,auVar95);
  auVar94 = vcmpps_avx(auVar94,auVar164,1);
  auVar15 = vblendvps_avx(auVar311,auVar164,auVar94);
  auVar94 = vandps_avx(auVar299,auVar95);
  auVar94 = vcmpps_avx(auVar94,auVar164,1);
  auVar16 = vblendvps_avx(auVar299,auVar164,auVar94);
  auVar94 = vandps_avx(auVar216,auVar95);
  auVar94 = vcmpps_avx(auVar94,auVar164,1);
  auVar94 = vblendvps_avx(auVar216,auVar164,auVar94);
  auVar17 = vrcpps_avx(auVar15);
  fVar198 = auVar17._0_4_;
  fVar217 = auVar17._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar217;
  auVar18._0_4_ = auVar15._0_4_ * fVar198;
  fVar218 = auVar17._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar218;
  fVar219 = auVar17._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar219;
  fVar220 = auVar17._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar220;
  fVar221 = auVar17._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar221;
  fVar222 = auVar17._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar222;
  auVar18._28_4_ = auVar15._28_4_;
  auVar262._8_4_ = 0x3f800000;
  auVar262._0_8_ = &DAT_3f8000003f800000;
  auVar262._12_4_ = 0x3f800000;
  auVar262._16_4_ = 0x3f800000;
  auVar262._20_4_ = 0x3f800000;
  auVar262._24_4_ = 0x3f800000;
  auVar262._28_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar262,auVar18);
  fVar198 = fVar198 + fVar198 * auVar18._0_4_;
  fVar217 = fVar217 + fVar217 * auVar18._4_4_;
  fVar218 = fVar218 + fVar218 * auVar18._8_4_;
  fVar219 = fVar219 + fVar219 * auVar18._12_4_;
  fVar220 = fVar220 + fVar220 * auVar18._16_4_;
  fVar221 = fVar221 + fVar221 * auVar18._20_4_;
  fVar222 = fVar222 + fVar222 * auVar18._24_4_;
  auVar15 = vrcpps_avx(auVar16);
  fVar145 = auVar15._0_4_;
  fVar171 = auVar15._4_4_;
  auVar19._4_4_ = fVar171 * auVar16._4_4_;
  auVar19._0_4_ = fVar145 * auVar16._0_4_;
  fVar172 = auVar15._8_4_;
  auVar19._8_4_ = fVar172 * auVar16._8_4_;
  fVar173 = auVar15._12_4_;
  auVar19._12_4_ = fVar173 * auVar16._12_4_;
  fVar174 = auVar15._16_4_;
  auVar19._16_4_ = fVar174 * auVar16._16_4_;
  fVar175 = auVar15._20_4_;
  auVar19._20_4_ = fVar175 * auVar16._20_4_;
  fVar176 = auVar15._24_4_;
  auVar19._24_4_ = fVar176 * auVar16._24_4_;
  auVar19._28_4_ = auVar18._28_4_;
  auVar15 = vsubps_avx(auVar262,auVar19);
  fVar145 = fVar145 + fVar145 * auVar15._0_4_;
  fVar171 = fVar171 + fVar171 * auVar15._4_4_;
  fVar172 = fVar172 + fVar172 * auVar15._8_4_;
  fVar173 = fVar173 + fVar173 * auVar15._12_4_;
  fVar174 = fVar174 + fVar174 * auVar15._16_4_;
  fVar175 = fVar175 + fVar175 * auVar15._20_4_;
  fVar176 = fVar176 + fVar176 * auVar15._24_4_;
  auVar15 = vrcpps_avx(auVar94);
  fVar177 = auVar15._0_4_;
  fVar190 = auVar15._4_4_;
  auVar16._4_4_ = fVar190 * auVar94._4_4_;
  auVar16._0_4_ = fVar177 * auVar94._0_4_;
  fVar192 = auVar15._8_4_;
  auVar16._8_4_ = fVar192 * auVar94._8_4_;
  fVar193 = auVar15._12_4_;
  auVar16._12_4_ = fVar193 * auVar94._12_4_;
  fVar195 = auVar15._16_4_;
  auVar16._16_4_ = fVar195 * auVar94._16_4_;
  fVar196 = auVar15._20_4_;
  auVar16._20_4_ = fVar196 * auVar94._20_4_;
  fVar197 = auVar15._24_4_;
  auVar16._24_4_ = fVar197 * auVar94._24_4_;
  auVar16._28_4_ = auVar94._28_4_;
  auVar94 = vsubps_avx(auVar262,auVar16);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar114 = vpmovsxwd_avx(auVar114);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar81 * 7 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar204);
  fVar177 = fVar177 + fVar177 * auVar94._0_4_;
  fVar190 = fVar190 + fVar190 * auVar94._4_4_;
  fVar192 = fVar192 + fVar192 * auVar94._8_4_;
  fVar193 = fVar193 + fVar193 * auVar94._12_4_;
  fVar195 = fVar195 + fVar195 * auVar94._16_4_;
  fVar196 = fVar196 + fVar196 * auVar94._20_4_;
  fVar197 = fVar197 + fVar197 * auVar94._24_4_;
  auVar96._16_16_ = auVar204;
  auVar96._0_16_ = auVar114;
  auVar94 = vcvtdq2ps_avx(auVar96);
  auVar94 = vsubps_avx(auVar94,auVar231);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + lVar82 + 6);
  auVar114 = vpmovsxwd_avx(auVar214);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar82 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar5);
  auVar90._0_4_ = fVar198 * auVar94._0_4_;
  auVar90._4_4_ = fVar217 * auVar94._4_4_;
  auVar90._8_4_ = fVar218 * auVar94._8_4_;
  auVar90._12_4_ = fVar219 * auVar94._12_4_;
  auVar20._16_4_ = fVar220 * auVar94._16_4_;
  auVar20._0_16_ = auVar90;
  auVar20._20_4_ = fVar221 * auVar94._20_4_;
  auVar20._24_4_ = fVar222 * auVar94._24_4_;
  auVar20._28_4_ = auVar94._28_4_;
  auVar246._16_16_ = auVar204;
  auVar246._0_16_ = auVar114;
  auVar94 = vcvtdq2ps_avx(auVar246);
  auVar94 = vsubps_avx(auVar94,auVar231);
  lVar86 = (ulong)(byte)PVar8 * 0x10;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *(ulong *)(prim + lVar86 + 6);
  auVar114 = vpmovsxwd_avx(auVar293);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar86 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar6);
  lVar86 = lVar86 + uVar81 * -2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar86 + 6);
  auVar214 = vpmovsxwd_avx(auVar7);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + lVar86 + 0xe);
  auVar5 = vpmovsxwd_avx(auVar159);
  auVar200._0_4_ = fVar198 * auVar94._0_4_;
  auVar200._4_4_ = fVar217 * auVar94._4_4_;
  auVar200._8_4_ = fVar218 * auVar94._8_4_;
  auVar200._12_4_ = fVar219 * auVar94._12_4_;
  auVar21._16_4_ = fVar220 * auVar94._16_4_;
  auVar21._0_16_ = auVar200;
  auVar21._20_4_ = fVar221 * auVar94._20_4_;
  auVar21._24_4_ = fVar222 * auVar94._24_4_;
  auVar21._28_4_ = auVar17._28_4_ + auVar18._28_4_;
  auVar232._16_16_ = auVar5;
  auVar232._0_16_ = auVar214;
  auVar94 = vcvtdq2ps_avx(auVar232);
  auVar94 = vsubps_avx(auVar94,auVar139);
  auVar223._0_4_ = fVar145 * auVar94._0_4_;
  auVar223._4_4_ = fVar171 * auVar94._4_4_;
  auVar223._8_4_ = fVar172 * auVar94._8_4_;
  auVar223._12_4_ = fVar173 * auVar94._12_4_;
  auVar17._16_4_ = fVar174 * auVar94._16_4_;
  auVar17._0_16_ = auVar223;
  auVar17._20_4_ = fVar175 * auVar94._20_4_;
  auVar17._24_4_ = fVar176 * auVar94._24_4_;
  auVar17._28_4_ = auVar94._28_4_;
  auVar247._16_16_ = auVar204;
  auVar247._0_16_ = auVar114;
  auVar94 = vcvtdq2ps_avx(auVar247);
  auVar94 = vsubps_avx(auVar94,auVar139);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar88 + uVar81 + 6);
  auVar114 = vpmovsxwd_avx(auVar113);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar88 + uVar81 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar158);
  auVar129._0_4_ = fVar145 * auVar94._0_4_;
  auVar129._4_4_ = fVar171 * auVar94._4_4_;
  auVar129._8_4_ = fVar172 * auVar94._8_4_;
  auVar129._12_4_ = fVar173 * auVar94._12_4_;
  auVar22._16_4_ = fVar174 * auVar94._16_4_;
  auVar22._0_16_ = auVar129;
  auVar22._20_4_ = fVar175 * auVar94._20_4_;
  auVar22._24_4_ = fVar176 * auVar94._24_4_;
  auVar22._28_4_ = auVar94._28_4_;
  auVar165._16_16_ = auVar204;
  auVar165._0_16_ = auVar114;
  auVar94 = vcvtdq2ps_avx(auVar165);
  auVar94 = vsubps_avx(auVar94,auVar123);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar114 = vpmovsxwd_avx(auVar92);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar131);
  auVar146._0_4_ = fVar177 * auVar94._0_4_;
  auVar146._4_4_ = fVar190 * auVar94._4_4_;
  auVar146._8_4_ = fVar192 * auVar94._8_4_;
  auVar146._12_4_ = fVar193 * auVar94._12_4_;
  auVar25._16_4_ = fVar195 * auVar94._16_4_;
  auVar25._0_16_ = auVar146;
  auVar25._20_4_ = fVar196 * auVar94._20_4_;
  auVar25._24_4_ = fVar197 * auVar94._24_4_;
  auVar25._28_4_ = auVar94._28_4_;
  auVar248._16_16_ = auVar204;
  auVar248._0_16_ = auVar114;
  auVar94 = vcvtdq2ps_avx(auVar248);
  auVar94 = vsubps_avx(auVar94,auVar123);
  auVar106._0_4_ = fVar177 * auVar94._0_4_;
  auVar106._4_4_ = fVar190 * auVar94._4_4_;
  auVar106._8_4_ = fVar192 * auVar94._8_4_;
  auVar106._12_4_ = fVar193 * auVar94._12_4_;
  auVar26._16_4_ = fVar195 * auVar94._16_4_;
  auVar26._0_16_ = auVar106;
  auVar26._20_4_ = fVar196 * auVar94._20_4_;
  auVar26._24_4_ = fVar197 * auVar94._24_4_;
  auVar26._28_4_ = auVar94._28_4_;
  auVar114 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar204 = vpminsd_avx(auVar90,auVar200);
  auVar289._16_16_ = auVar114;
  auVar289._0_16_ = auVar204;
  auVar114 = vpminsd_avx(auVar17._16_16_,auVar22._16_16_);
  auVar204 = vpminsd_avx(auVar223,auVar129);
  auVar300._16_16_ = auVar114;
  auVar300._0_16_ = auVar204;
  auVar94 = vmaxps_avx(auVar289,auVar300);
  auVar114 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar204 = vpminsd_avx(auVar146,auVar106);
  auVar326._16_16_ = auVar114;
  auVar326._0_16_ = auVar204;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar333._4_4_ = uVar2;
  auVar333._0_4_ = uVar2;
  auVar333._8_4_ = uVar2;
  auVar333._12_4_ = uVar2;
  auVar333._16_4_ = uVar2;
  auVar333._20_4_ = uVar2;
  auVar333._24_4_ = uVar2;
  auVar333._28_4_ = uVar2;
  auVar15 = vmaxps_avx(auVar326,auVar333);
  auVar94 = vmaxps_avx(auVar94,auVar15);
  local_2c0._4_4_ = auVar94._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar94._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar94._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar94._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar94._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar94._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar94._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar94._28_4_;
  auVar114 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar204 = vpmaxsd_avx(auVar90,auVar200);
  auVar97._16_16_ = auVar114;
  auVar97._0_16_ = auVar204;
  auVar114 = vpmaxsd_avx(auVar17._16_16_,auVar22._16_16_);
  auVar204 = vpmaxsd_avx(auVar223,auVar129);
  auVar140._16_16_ = auVar114;
  auVar140._0_16_ = auVar204;
  auVar94 = vminps_avx(auVar97,auVar140);
  auVar114 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar204 = vpmaxsd_avx(auVar146,auVar106);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar166._4_4_ = uVar2;
  auVar166._0_4_ = uVar2;
  auVar166._8_4_ = uVar2;
  auVar166._12_4_ = uVar2;
  auVar166._16_4_ = uVar2;
  auVar166._20_4_ = uVar2;
  auVar166._24_4_ = uVar2;
  auVar166._28_4_ = uVar2;
  auVar124._16_16_ = auVar114;
  auVar124._0_16_ = auVar204;
  auVar15 = vminps_avx(auVar124,auVar166);
  auVar94 = vminps_avx(auVar94,auVar15);
  auVar15._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar94._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar94._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar94._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar94._28_4_;
  auVar94 = vcmpps_avx(local_2c0,auVar15,2);
  auVar114 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar125._16_16_ = auVar114;
  auVar125._0_16_ = auVar114;
  auVar15 = vcvtdq2ps_avx(auVar125);
  auVar15 = vcmpps_avx(_DAT_02020f40,auVar15,1);
  auVar94 = vandps_avx(auVar94,auVar15);
  uVar80 = vmovmskps_avx(auVar94);
  local_711 = uVar80 != 0;
  if (uVar80 == 0) {
    return local_711;
  }
  uVar80 = uVar80 & 0xff;
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  uVar85 = 1 << ((byte)k & 0x1f);
  local_340 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
  uVar81 = (ulong)((uVar85 & 0xf) << 4);
  lVar86 = (long)((int)uVar85 >> 4) * 0x10;
  auVar334 = ZEXT1664((undefined1  [16])0x0);
LAB_01173044:
  uVar88 = (ulong)uVar80;
  lVar82 = 0;
  if (uVar88 != 0) {
    for (; (uVar80 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
    }
  }
  uVar80 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar80].ptr;
  uVar87 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar82 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var12 + uVar87 * (long)pvVar11);
  fVar198 = *pfVar1;
  fVar217 = pfVar1[1];
  fVar218 = pfVar1[2];
  fVar219 = pfVar1[3];
  auVar114 = *(undefined1 (*) [16])(_Var12 + (uVar87 + 1) * (long)pvVar11);
  pfVar1 = (float *)(_Var12 + (uVar87 + 2) * (long)pvVar11);
  fVar220 = *pfVar1;
  fVar221 = pfVar1[1];
  fVar222 = pfVar1[2];
  fVar145 = pfVar1[3];
  pfVar1 = (float *)(_Var12 + (long)pvVar11 * (uVar87 + 3));
  fVar171 = *pfVar1;
  fVar172 = pfVar1[1];
  fVar173 = pfVar1[2];
  fVar174 = pfVar1[3];
  uVar88 = uVar88 - 1 & uVar88;
  lVar13 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar13 + (long)p_Var10 * uVar87);
  fVar175 = *pfVar1;
  fVar176 = pfVar1[1];
  fVar177 = pfVar1[2];
  fVar190 = pfVar1[3];
  pfVar1 = (float *)(lVar13 + (long)p_Var10 * (uVar87 + 1));
  fVar192 = *pfVar1;
  fVar193 = pfVar1[1];
  fVar195 = pfVar1[2];
  fVar196 = pfVar1[3];
  pfVar1 = (float *)(lVar13 + (long)p_Var10 * (uVar87 + 2));
  fVar197 = *pfVar1;
  fVar23 = pfVar1[1];
  fVar24 = pfVar1[2];
  fVar301 = pfVar1[3];
  lVar14 = 0;
  if (uVar88 != 0) {
    for (; (uVar88 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  pfVar1 = (float *)(lVar13 + (long)p_Var10 * (uVar87 + 3));
  fVar191 = *pfVar1;
  fVar302 = pfVar1[1];
  fVar194 = pfVar1[2];
  fVar303 = pfVar1[3];
  if (((uVar88 != 0) && (uVar87 = uVar88 - 1 & uVar88, uVar87 != 0)) && (lVar13 = 0, uVar87 != 0)) {
    for (; (uVar87 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
    }
  }
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar214 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar307 = auVar334._8_4_;
  fVar235 = auVar334._12_4_;
  auVar107._0_4_ = fVar192 * 0.0 + fVar197 * 0.5 + fVar191 * 0.0;
  auVar107._4_4_ = fVar193 * 0.0 + fVar23 * 0.5 + fVar302 * 0.0;
  auVar107._8_4_ = fVar195 * fVar307 + fVar24 * 0.5 + fVar194 * fVar307;
  auVar107._12_4_ = fVar196 * fVar235 + fVar301 * 0.5 + fVar303 * fVar235;
  auVar291._0_4_ = fVar175 * 0.5;
  auVar291._4_4_ = fVar176 * 0.5;
  auVar291._8_4_ = fVar177 * 0.5;
  auVar291._12_4_ = fVar190 * 0.5;
  auVar113 = vsubps_avx(auVar107,auVar291);
  fVar304 = auVar114._0_4_;
  fVar305 = auVar114._4_4_;
  fVar306 = auVar114._8_4_;
  fVar234 = auVar114._12_4_;
  auVar292._0_4_ = fVar304 * 0.0 + fVar220 * 0.5 + fVar171 * 0.0;
  auVar292._4_4_ = fVar305 * 0.0 + fVar221 * 0.5 + fVar172 * 0.0;
  auVar292._8_4_ = fVar306 * 0.0 + fVar222 * 0.5 + fVar307 * fVar173;
  auVar292._12_4_ = fVar234 * 0.0 + fVar145 * 0.5 + fVar235 * fVar174;
  auVar337._0_4_ = fVar198 * 0.5;
  auVar337._4_4_ = fVar217 * 0.5;
  auVar337._8_4_ = fVar218 * 0.5;
  auVar337._12_4_ = fVar219 * 0.5;
  auVar293 = vsubps_avx(auVar292,auVar337);
  auVar338._0_4_ = fVar192 + fVar197 * 0.0 + fVar191 * -0.0 + fVar175 * -0.0;
  auVar338._4_4_ = fVar193 + fVar23 * 0.0 + fVar302 * -0.0 + fVar176 * -0.0;
  auVar338._8_4_ = fVar195 + fVar307 * fVar24 + fVar194 * -0.0 + fVar177 * -0.0;
  auVar338._12_4_ = fVar196 + fVar235 * fVar301 + fVar303 * -0.0 + fVar190 * -0.0;
  local_680._0_4_ = fVar175 * -0.0 + fVar192 * 0.0 + fVar197 + fVar191 * -0.0;
  local_680._4_4_ = fVar176 * -0.0 + fVar193 * 0.0 + fVar23 + fVar302 * -0.0;
  fStack_678 = fVar177 * -0.0 + fVar195 * fVar307 + fVar24 + fVar194 * -0.0;
  fStack_674 = fVar190 * -0.0 + fVar196 * fVar235 + fVar301 + fVar303 * -0.0;
  auVar281._0_4_ = fVar197 * 0.0 + fVar191 * 0.5;
  auVar281._4_4_ = fVar23 * 0.0 + fVar302 * 0.5;
  auVar281._8_4_ = fVar307 * fVar24 + fVar194 * 0.5;
  auVar281._12_4_ = fVar235 * fVar301 + fVar303 * 0.5;
  auVar265._0_4_ = fVar192 * 0.5;
  auVar265._4_4_ = fVar193 * 0.5;
  auVar265._8_4_ = fVar195 * 0.5;
  auVar265._12_4_ = fVar196 * 0.5;
  auVar114 = vsubps_avx(auVar281,auVar265);
  auVar308._0_4_ = fVar198 * -0.0 + fVar171 * -0.0 + fVar220 * 0.0 + fVar304;
  auVar308._4_4_ = fVar217 * -0.0 + fVar172 * -0.0 + fVar221 * 0.0 + fVar305;
  auVar308._8_4_ = fVar218 * -0.0 + fVar173 * -0.0 + fVar222 * 0.0 + fVar306;
  auVar308._12_4_ = fVar219 * -0.0 + fVar174 * -0.0 + fVar145 * 0.0 + fVar234;
  auVar224._0_4_ = auVar114._0_4_ + fVar175 * 0.0;
  auVar224._4_4_ = auVar114._4_4_ + fVar176 * 0.0;
  auVar224._8_4_ = auVar114._8_4_ + fVar177 * 0.0;
  auVar224._12_4_ = auVar114._12_4_ + fVar190 * 0.0;
  auVar266._0_4_ = fVar198 * -0.0 + fVar304 * 0.0 + fVar220 + fVar171 * -0.0;
  auVar266._4_4_ = fVar217 * -0.0 + fVar305 * 0.0 + fVar221 + fVar172 * -0.0;
  auVar266._8_4_ = fVar218 * -0.0 + fVar306 * 0.0 + fVar222 + fVar173 * -0.0;
  auVar266._12_4_ = fVar219 * -0.0 + fVar234 * 0.0 + fVar145 + fVar174 * -0.0;
  auVar147._0_4_ = fVar220 * 0.0 + fVar171 * 0.5;
  auVar147._4_4_ = fVar221 * 0.0 + fVar172 * 0.5;
  auVar147._8_4_ = fVar222 * 0.0 + fVar173 * 0.5;
  auVar147._12_4_ = fVar145 * 0.0 + fVar174 * 0.5;
  auVar201._0_4_ = fVar304 * 0.5;
  auVar201._4_4_ = fVar305 * 0.5;
  auVar201._8_4_ = fVar306 * 0.5;
  auVar201._12_4_ = fVar234 * 0.5;
  auVar114 = vsubps_avx(auVar147,auVar201);
  auVar202._0_4_ = fVar198 * 0.0 + auVar114._0_4_;
  auVar202._4_4_ = fVar217 * 0.0 + auVar114._4_4_;
  auVar202._8_4_ = fVar218 * 0.0 + auVar114._8_4_;
  auVar202._12_4_ = fVar219 * 0.0 + auVar114._12_4_;
  auVar114 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar204 = vshufps_avx(auVar308,auVar308,0xc9);
  fVar177 = auVar113._0_4_;
  auVar237._0_4_ = fVar177 * auVar204._0_4_;
  fVar190 = auVar113._4_4_;
  auVar237._4_4_ = fVar190 * auVar204._4_4_;
  fVar192 = auVar113._8_4_;
  auVar237._8_4_ = fVar192 * auVar204._8_4_;
  fVar193 = auVar113._12_4_;
  auVar237._12_4_ = fVar193 * auVar204._12_4_;
  auVar250._0_4_ = auVar308._0_4_ * auVar114._0_4_;
  auVar250._4_4_ = auVar308._4_4_ * auVar114._4_4_;
  auVar250._8_4_ = auVar308._8_4_ * auVar114._8_4_;
  auVar250._12_4_ = auVar308._12_4_ * auVar114._12_4_;
  auVar204 = vsubps_avx(auVar250,auVar237);
  auVar5 = vshufps_avx(auVar204,auVar204,0xc9);
  auVar204 = vshufps_avx(auVar293,auVar293,0xc9);
  auVar238._0_4_ = fVar177 * auVar204._0_4_;
  auVar238._4_4_ = fVar190 * auVar204._4_4_;
  auVar238._8_4_ = fVar192 * auVar204._8_4_;
  auVar238._12_4_ = fVar193 * auVar204._12_4_;
  auVar148._0_4_ = auVar293._0_4_ * auVar114._0_4_;
  auVar148._4_4_ = auVar293._4_4_ * auVar114._4_4_;
  auVar148._8_4_ = auVar293._8_4_ * auVar114._8_4_;
  auVar148._12_4_ = auVar293._12_4_ * auVar114._12_4_;
  auVar114 = vsubps_avx(auVar148,auVar238);
  auVar293 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar204 = vshufps_avx(auVar224,auVar224,0xc9);
  auVar114 = vshufps_avx(auVar266,auVar266,0xc9);
  auVar149._0_4_ = auVar224._0_4_ * auVar114._0_4_;
  auVar149._4_4_ = auVar224._4_4_ * auVar114._4_4_;
  auVar149._8_4_ = auVar224._8_4_ * auVar114._8_4_;
  auVar149._12_4_ = auVar224._12_4_ * auVar114._12_4_;
  auVar267._0_4_ = auVar266._0_4_ * auVar204._0_4_;
  auVar267._4_4_ = auVar266._4_4_ * auVar204._4_4_;
  auVar267._8_4_ = auVar266._8_4_ * auVar204._8_4_;
  auVar267._12_4_ = auVar266._12_4_ * auVar204._12_4_;
  auVar114 = vsubps_avx(auVar267,auVar149);
  auVar6 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar114 = vshufps_avx(auVar202,auVar202,0xc9);
  auVar268._0_4_ = auVar114._0_4_ * auVar224._0_4_;
  auVar268._4_4_ = auVar114._4_4_ * auVar224._4_4_;
  auVar268._8_4_ = auVar114._8_4_ * auVar224._8_4_;
  auVar268._12_4_ = auVar114._12_4_ * auVar224._12_4_;
  auVar114 = vdpps_avx(auVar5,auVar5,0x7f);
  auVar203._0_4_ = auVar204._0_4_ * auVar202._0_4_;
  auVar203._4_4_ = auVar204._4_4_ * auVar202._4_4_;
  auVar203._8_4_ = auVar204._8_4_ * auVar202._8_4_;
  auVar203._12_4_ = auVar204._12_4_ * auVar202._12_4_;
  auVar204 = vsubps_avx(auVar203,auVar268);
  auVar7 = vshufps_avx(auVar204,auVar204,0xc9);
  fVar220 = auVar114._0_4_;
  auVar92 = ZEXT416((uint)fVar220);
  auVar204 = vrsqrtss_avx(auVar92,auVar92);
  fVar198 = auVar204._0_4_;
  auVar204 = ZEXT416((uint)(fVar198 * 1.5 - fVar220 * 0.5 * fVar198 * fVar198 * fVar198));
  auVar159 = vshufps_avx(auVar204,auVar204,0);
  auVar204 = vdpps_avx(auVar5,auVar293,0x7f);
  fVar198 = auVar5._0_4_ * auVar159._0_4_;
  fVar217 = auVar5._4_4_ * auVar159._4_4_;
  fVar218 = auVar5._8_4_ * auVar159._8_4_;
  fVar219 = auVar5._12_4_ * auVar159._12_4_;
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar282._0_4_ = auVar293._0_4_ * auVar114._0_4_;
  auVar282._4_4_ = auVar293._4_4_ * auVar114._4_4_;
  auVar282._8_4_ = auVar293._8_4_ * auVar114._8_4_;
  auVar282._12_4_ = auVar293._12_4_ * auVar114._12_4_;
  auVar114 = vshufps_avx(auVar204,auVar204,0);
  auVar251._0_4_ = auVar5._0_4_ * auVar114._0_4_;
  auVar251._4_4_ = auVar5._4_4_ * auVar114._4_4_;
  auVar251._8_4_ = auVar5._8_4_ * auVar114._8_4_;
  auVar251._12_4_ = auVar5._12_4_ * auVar114._12_4_;
  auVar158 = vsubps_avx(auVar282,auVar251);
  auVar114 = vrcpss_avx(auVar92,auVar92);
  auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar220 * auVar114._0_4_)));
  auVar5 = vshufps_avx(auVar114,auVar114,0);
  auVar114 = vdpps_avx(auVar6,auVar6,0x7f);
  fVar220 = auVar114._0_4_;
  auVar92 = ZEXT416((uint)fVar220);
  auVar204 = vrsqrtss_avx(auVar92,auVar92);
  fVar221 = auVar204._0_4_;
  auVar204 = vdpps_avx(auVar6,auVar7,0x7f);
  auVar293 = ZEXT416((uint)(fVar221 * 1.5 - fVar220 * 0.5 * fVar221 * fVar221 * fVar221));
  auVar293 = vshufps_avx(auVar293,auVar293,0);
  fVar221 = auVar293._0_4_ * auVar6._0_4_;
  fVar222 = auVar293._4_4_ * auVar6._4_4_;
  fVar145 = auVar293._8_4_ * auVar6._8_4_;
  fVar171 = auVar293._12_4_ * auVar6._12_4_;
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar239._0_4_ = auVar114._0_4_ * auVar7._0_4_;
  auVar239._4_4_ = auVar114._4_4_ * auVar7._4_4_;
  auVar239._8_4_ = auVar114._8_4_ * auVar7._8_4_;
  auVar239._12_4_ = auVar114._12_4_ * auVar7._12_4_;
  auVar114 = vshufps_avx(auVar204,auVar204,0);
  auVar150._0_4_ = auVar114._0_4_ * auVar6._0_4_;
  auVar150._4_4_ = auVar114._4_4_ * auVar6._4_4_;
  auVar150._8_4_ = auVar114._8_4_ * auVar6._8_4_;
  auVar150._12_4_ = auVar114._12_4_ * auVar6._12_4_;
  auVar7 = vsubps_avx(auVar239,auVar150);
  auVar114 = vrcpss_avx(auVar92,auVar92);
  auVar114 = ZEXT416((uint)((2.0 - fVar220 * auVar114._0_4_) * auVar114._0_4_));
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar204 = vshufps_avx(auVar338,auVar338,0xff);
  auVar269._0_4_ = auVar204._0_4_ * fVar198;
  auVar269._4_4_ = auVar204._4_4_ * fVar217;
  auVar269._8_4_ = auVar204._8_4_ * fVar218;
  auVar269._12_4_ = auVar204._12_4_ * fVar219;
  _local_4a0 = vsubps_avx(auVar338,auVar269);
  auVar6 = vshufps_avx(auVar113,auVar113,0xff);
  auVar205._0_4_ =
       auVar6._0_4_ * fVar198 + auVar159._0_4_ * auVar158._0_4_ * auVar5._0_4_ * auVar204._0_4_;
  auVar205._4_4_ =
       auVar6._4_4_ * fVar217 + auVar159._4_4_ * auVar158._4_4_ * auVar5._4_4_ * auVar204._4_4_;
  auVar205._8_4_ =
       auVar6._8_4_ * fVar218 + auVar159._8_4_ * auVar158._8_4_ * auVar5._8_4_ * auVar204._8_4_;
  auVar205._12_4_ =
       auVar6._12_4_ * fVar219 + auVar159._12_4_ * auVar158._12_4_ * auVar5._12_4_ * auVar204._12_4_
  ;
  auVar6 = vsubps_avx(auVar113,auVar205);
  local_4b0._0_4_ = auVar338._0_4_ + auVar269._0_4_;
  local_4b0._4_4_ = auVar338._4_4_ + auVar269._4_4_;
  fStack_4a8 = auVar338._8_4_ + auVar269._8_4_;
  fStack_4a4 = auVar338._12_4_ + auVar269._12_4_;
  auVar204 = vshufps_avx(_local_680,_local_680,0xff);
  auVar178._0_4_ = fVar221 * auVar204._0_4_;
  auVar178._4_4_ = fVar222 * auVar204._4_4_;
  auVar178._8_4_ = fVar145 * auVar204._8_4_;
  auVar178._12_4_ = fVar171 * auVar204._12_4_;
  _local_4c0 = vsubps_avx(_local_680,auVar178);
  auVar5 = vshufps_avx(auVar224,auVar224,0xff);
  auVar108._0_4_ =
       fVar221 * auVar5._0_4_ + auVar204._0_4_ * auVar293._0_4_ * auVar7._0_4_ * auVar114._0_4_;
  auVar108._4_4_ =
       fVar222 * auVar5._4_4_ + auVar204._4_4_ * auVar293._4_4_ * auVar7._4_4_ * auVar114._4_4_;
  auVar108._8_4_ =
       fVar145 * auVar5._8_4_ + auVar204._8_4_ * auVar293._8_4_ * auVar7._8_4_ * auVar114._8_4_;
  auVar108._12_4_ =
       fVar171 * auVar5._12_4_ + auVar204._12_4_ * auVar293._12_4_ * auVar7._12_4_ * auVar114._12_4_
  ;
  auVar293 = vsubps_avx(auVar224,auVar108);
  local_680._0_4_ = (float)local_680._0_4_ + auVar178._0_4_;
  local_680._4_4_ = (float)local_680._4_4_ + auVar178._4_4_;
  fStack_678 = fStack_678 + auVar178._8_4_;
  fStack_674 = fStack_674 + auVar178._12_4_;
  local_4d0._0_4_ = local_4a0._0_4_ + auVar6._0_4_ * 0.33333334;
  local_4d0._4_4_ = local_4a0._4_4_ + auVar6._4_4_ * 0.33333334;
  fStack_4c8 = local_4a0._8_4_ + auVar6._8_4_ * 0.33333334;
  fStack_4c4 = local_4a0._12_4_ + auVar6._12_4_ * 0.33333334;
  local_380 = vsubps_avx(_local_4a0,auVar214);
  auVar204 = vmovsldup_avx(local_380);
  auVar114 = vmovshdup_avx(local_380);
  auVar5 = vshufps_avx(local_380,local_380,0xaa);
  fVar198 = pre->ray_space[k].vx.field_0.m128[0];
  fVar217 = pre->ray_space[k].vx.field_0.m128[1];
  fVar218 = pre->ray_space[k].vx.field_0.m128[2];
  fVar219 = pre->ray_space[k].vx.field_0.m128[3];
  fVar220 = pre->ray_space[k].vy.field_0.m128[0];
  fVar221 = pre->ray_space[k].vy.field_0.m128[1];
  fVar222 = pre->ray_space[k].vy.field_0.m128[2];
  fVar145 = pre->ray_space[k].vy.field_0.m128[3];
  fVar171 = pre->ray_space[k].vz.field_0.m128[0];
  fVar172 = pre->ray_space[k].vz.field_0.m128[1];
  fVar173 = pre->ray_space[k].vz.field_0.m128[2];
  fVar174 = pre->ray_space[k].vz.field_0.m128[3];
  auVar309._0_4_ = fVar198 * auVar204._0_4_ + auVar5._0_4_ * fVar171 + fVar220 * auVar114._0_4_;
  auVar309._4_4_ = fVar217 * auVar204._4_4_ + auVar5._4_4_ * fVar172 + fVar221 * auVar114._4_4_;
  auVar309._8_4_ = fVar218 * auVar204._8_4_ + auVar5._8_4_ * fVar173 + fVar222 * auVar114._8_4_;
  auVar309._12_4_ = fVar219 * auVar204._12_4_ + auVar5._12_4_ * fVar174 + fVar145 * auVar114._12_4_;
  local_390 = vsubps_avx(_local_4d0,auVar214);
  auVar5 = vshufps_avx(local_390,local_390,0xaa);
  auVar114 = vmovshdup_avx(local_390);
  auVar204 = vmovsldup_avx(local_390);
  fVar175 = auVar204._0_4_ * fVar198 + auVar114._0_4_ * fVar220 + fVar171 * auVar5._0_4_;
  fVar176 = auVar204._4_4_ * fVar217 + auVar114._4_4_ * fVar221 + fVar172 * auVar5._4_4_;
  local_6c0._4_4_ = fVar176;
  local_6c0._0_4_ = fVar175;
  fStack_6b8 = auVar204._8_4_ * fVar218 + auVar114._8_4_ * fVar222 + fVar173 * auVar5._8_4_;
  fStack_6b4 = auVar204._12_4_ * fVar219 + auVar114._12_4_ * fVar145 + fVar174 * auVar5._12_4_;
  auVar206._0_4_ = auVar293._0_4_ * 0.33333334;
  auVar206._4_4_ = auVar293._4_4_ * 0.33333334;
  auVar206._8_4_ = auVar293._8_4_ * 0.33333334;
  auVar206._12_4_ = auVar293._12_4_ * 0.33333334;
  _local_4e0 = vsubps_avx(_local_4c0,auVar206);
  local_3a0 = vsubps_avx(_local_4e0,auVar214);
  auVar5 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar114 = vmovshdup_avx(local_3a0);
  auVar204 = vmovsldup_avx(local_3a0);
  auVar331._0_4_ = auVar204._0_4_ * fVar198 + auVar114._0_4_ * fVar220 + fVar171 * auVar5._0_4_;
  auVar331._4_4_ = auVar204._4_4_ * fVar217 + auVar114._4_4_ * fVar221 + fVar172 * auVar5._4_4_;
  auVar331._8_4_ = auVar204._8_4_ * fVar218 + auVar114._8_4_ * fVar222 + fVar173 * auVar5._8_4_;
  auVar331._12_4_ = auVar204._12_4_ * fVar219 + auVar114._12_4_ * fVar145 + fVar174 * auVar5._12_4_;
  local_3b0 = vsubps_avx(_local_4c0,auVar214);
  auVar5 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar114 = vmovshdup_avx(local_3b0);
  auVar204 = vmovsldup_avx(local_3b0);
  auVar322._0_8_ =
       CONCAT44(auVar204._4_4_ * fVar217 + auVar114._4_4_ * fVar221 + auVar5._4_4_ * fVar172,
                auVar204._0_4_ * fVar198 + auVar114._0_4_ * fVar220 + auVar5._0_4_ * fVar171);
  auVar322._8_4_ = auVar204._8_4_ * fVar218 + auVar114._8_4_ * fVar222 + auVar5._8_4_ * fVar173;
  auVar322._12_4_ = auVar204._12_4_ * fVar219 + auVar114._12_4_ * fVar145 + auVar5._12_4_ * fVar174;
  local_3c0 = vsubps_avx(_local_4b0,auVar214);
  auVar5 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar114 = vmovshdup_avx(local_3c0);
  auVar204 = vmovsldup_avx(local_3c0);
  auVar283._0_4_ = auVar204._0_4_ * fVar198 + auVar114._0_4_ * fVar220 + auVar5._0_4_ * fVar171;
  auVar283._4_4_ = auVar204._4_4_ * fVar217 + auVar114._4_4_ * fVar221 + auVar5._4_4_ * fVar172;
  auVar283._8_4_ = auVar204._8_4_ * fVar218 + auVar114._8_4_ * fVar222 + auVar5._8_4_ * fVar173;
  auVar283._12_4_ = auVar204._12_4_ * fVar219 + auVar114._12_4_ * fVar145 + auVar5._12_4_ * fVar174;
  local_4f0._0_4_ = (float)local_4b0._0_4_ + (fVar177 + auVar205._0_4_) * 0.33333334;
  local_4f0._4_4_ = (float)local_4b0._4_4_ + (fVar190 + auVar205._4_4_) * 0.33333334;
  fStack_4e8 = fStack_4a8 + (fVar192 + auVar205._8_4_) * 0.33333334;
  fStack_4e4 = fStack_4a4 + (fVar193 + auVar205._12_4_) * 0.33333334;
  local_3d0 = vsubps_avx(_local_4f0,auVar214);
  auVar5 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar114 = vmovshdup_avx(local_3d0);
  auVar204 = vmovsldup_avx(local_3d0);
  auVar270._0_4_ = auVar204._0_4_ * fVar198 + auVar114._0_4_ * fVar220 + auVar5._0_4_ * fVar171;
  auVar270._4_4_ = auVar204._4_4_ * fVar217 + auVar114._4_4_ * fVar221 + auVar5._4_4_ * fVar172;
  auVar270._8_4_ = auVar204._8_4_ * fVar218 + auVar114._8_4_ * fVar222 + auVar5._8_4_ * fVar173;
  auVar270._12_4_ = auVar204._12_4_ * fVar219 + auVar114._12_4_ * fVar145 + auVar5._12_4_ * fVar174;
  auVar240._0_4_ = (auVar224._0_4_ + auVar108._0_4_) * 0.33333334;
  auVar240._4_4_ = (auVar224._4_4_ + auVar108._4_4_) * 0.33333334;
  auVar240._8_4_ = (auVar224._8_4_ + auVar108._8_4_) * 0.33333334;
  auVar240._12_4_ = (auVar224._12_4_ + auVar108._12_4_) * 0.33333334;
  auVar73._4_4_ = local_680._4_4_;
  auVar73._0_4_ = local_680._0_4_;
  auVar73._8_4_ = fStack_678;
  auVar73._12_4_ = fStack_674;
  _local_500 = vsubps_avx(auVar73,auVar240);
  local_3e0 = vsubps_avx(_local_500,auVar214);
  auVar5 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar114 = vmovshdup_avx(local_3e0);
  auVar204 = vmovsldup_avx(local_3e0);
  auVar252._0_4_ = auVar204._0_4_ * fVar198 + auVar114._0_4_ * fVar220 + fVar171 * auVar5._0_4_;
  auVar252._4_4_ = auVar204._4_4_ * fVar217 + auVar114._4_4_ * fVar221 + fVar172 * auVar5._4_4_;
  auVar252._8_4_ = auVar204._8_4_ * fVar218 + auVar114._8_4_ * fVar222 + fVar173 * auVar5._8_4_;
  auVar252._12_4_ = auVar204._12_4_ * fVar219 + auVar114._12_4_ * fVar145 + fVar174 * auVar5._12_4_;
  local_3f0 = vsubps_avx(auVar73,auVar214);
  auVar214 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar114 = vmovshdup_avx(local_3f0);
  auVar204 = vmovsldup_avx(local_3f0);
  auVar241._0_4_ = fVar198 * auVar204._0_4_ + fVar220 * auVar114._0_4_ + fVar171 * auVar214._0_4_;
  auVar241._4_4_ = fVar217 * auVar204._4_4_ + fVar221 * auVar114._4_4_ + fVar172 * auVar214._4_4_;
  auVar241._8_4_ = fVar218 * auVar204._8_4_ + fVar222 * auVar114._8_4_ + fVar173 * auVar214._8_4_;
  auVar241._12_4_ =
       fVar219 * auVar204._12_4_ + fVar145 * auVar114._12_4_ + fVar174 * auVar214._12_4_;
  auVar5 = vmovlhps_avx(auVar309,auVar283);
  auVar293 = vmovlhps_avx(_local_6c0,auVar270);
  auVar6 = vmovlhps_avx(auVar331,auVar252);
  auVar7 = vmovlhps_avx(auVar322,auVar241);
  auVar114 = vminps_avx(auVar5,auVar293);
  auVar204 = vminps_avx(auVar6,auVar7);
  auVar214 = vminps_avx(auVar114,auVar204);
  auVar114 = vmaxps_avx(auVar5,auVar293);
  auVar204 = vmaxps_avx(auVar6,auVar7);
  auVar114 = vmaxps_avx(auVar114,auVar204);
  auVar204 = vshufpd_avx(auVar214,auVar214,3);
  auVar214 = vminps_avx(auVar214,auVar204);
  auVar204 = vshufpd_avx(auVar114,auVar114,3);
  auVar204 = vmaxps_avx(auVar114,auVar204);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar114 = vandps_avx(auVar214,auVar225);
  auVar204 = vandps_avx(auVar204,auVar225);
  auVar114 = vmaxps_avx(auVar114,auVar204);
  auVar204 = vmovshdup_avx(auVar114);
  auVar114 = vmaxss_avx(auVar204,auVar114);
  fVar217 = auVar114._0_4_ * 9.536743e-07;
  register0x00001548 = auVar322._0_8_;
  local_490 = auVar322._0_8_;
  auVar114 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
  local_280._16_16_ = auVar114;
  local_280._0_16_ = auVar114;
  auVar91._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
  auVar91._8_4_ = auVar114._8_4_ ^ 0x80000000;
  auVar91._12_4_ = auVar114._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar91;
  local_2a0._0_16_ = auVar91;
  auVar114 = vshufps_avx(ZEXT416(uVar80),ZEXT416(uVar80),0);
  local_2e0._16_16_ = auVar114;
  local_2e0._0_16_ = auVar114;
  auVar114 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar82 * 4 + 6)),0);
  local_300._16_16_ = auVar114;
  local_300._0_16_ = auVar114;
  bVar79 = false;
  uVar87 = 0;
  fVar198 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar293,auVar5);
  _local_360 = vsubps_avx(auVar6,auVar293);
  _local_370 = vsubps_avx(auVar7,auVar6);
  _local_410 = vsubps_avx(_local_4b0,_local_4a0);
  _local_420 = vsubps_avx(_local_4f0,_local_4d0);
  _local_430 = vsubps_avx(_local_500,_local_4e0);
  auVar74._4_4_ = local_680._4_4_;
  auVar74._0_4_ = local_680._0_4_;
  auVar74._8_4_ = fStack_678;
  auVar74._12_4_ = fStack_674;
  _local_440 = vsubps_avx(auVar74,_local_4c0);
  _local_6c0 = ZEXT816(0x3f80000000000000);
  local_400 = _local_6c0;
  do {
    auVar114 = vshufps_avx(_local_6c0,_local_6c0,0x50);
    auVar339._8_4_ = 0x3f800000;
    auVar339._0_8_ = &DAT_3f8000003f800000;
    auVar339._12_4_ = 0x3f800000;
    auVar344._16_4_ = 0x3f800000;
    auVar344._0_16_ = auVar339;
    auVar344._20_4_ = 0x3f800000;
    auVar344._24_4_ = 0x3f800000;
    auVar344._28_4_ = 0x3f800000;
    auVar204 = vsubps_avx(auVar339,auVar114);
    fVar218 = auVar114._0_4_;
    fVar219 = auVar114._4_4_;
    fVar220 = auVar114._8_4_;
    fVar221 = auVar114._12_4_;
    fVar222 = auVar204._0_4_;
    fVar145 = auVar204._4_4_;
    fVar171 = auVar204._8_4_;
    fVar172 = auVar204._12_4_;
    auVar130._0_4_ = auVar283._0_4_ * fVar218 + fVar222 * auVar309._0_4_;
    auVar130._4_4_ = auVar283._4_4_ * fVar219 + fVar145 * auVar309._4_4_;
    auVar130._8_4_ = auVar283._0_4_ * fVar220 + fVar171 * auVar309._0_4_;
    auVar130._12_4_ = auVar283._4_4_ * fVar221 + fVar172 * auVar309._4_4_;
    auVar109._0_4_ = auVar270._0_4_ * fVar218 + fVar175 * fVar222;
    auVar109._4_4_ = auVar270._4_4_ * fVar219 + fVar176 * fVar145;
    auVar109._8_4_ = auVar270._0_4_ * fVar220 + fVar175 * fVar171;
    auVar109._12_4_ = auVar270._4_4_ * fVar221 + fVar176 * fVar172;
    auVar242._0_4_ = auVar252._0_4_ * fVar218 + auVar331._0_4_ * fVar222;
    auVar242._4_4_ = auVar252._4_4_ * fVar219 + auVar331._4_4_ * fVar145;
    auVar242._8_4_ = auVar252._0_4_ * fVar220 + auVar331._0_4_ * fVar171;
    auVar242._12_4_ = auVar252._4_4_ * fVar221 + auVar331._4_4_ * fVar172;
    auVar151._0_4_ = auVar241._0_4_ * fVar218 + local_490._0_4_ * fVar222;
    auVar151._4_4_ = auVar241._4_4_ * fVar219 + local_490._4_4_ * fVar145;
    auVar151._8_4_ = auVar241._0_4_ * fVar220 + local_490._8_4_ * fVar171;
    auVar151._12_4_ = auVar241._4_4_ * fVar221 + local_490._12_4_ * fVar172;
    auVar114 = vmovshdup_avx(local_400);
    auVar204 = vshufps_avx(local_400,local_400,0);
    auVar263._16_16_ = auVar204;
    auVar263._0_16_ = auVar204;
    auVar214 = vshufps_avx(local_400,local_400,0x55);
    auVar99._16_16_ = auVar214;
    auVar99._0_16_ = auVar214;
    auVar94 = vsubps_avx(auVar99,auVar263);
    auVar214 = vshufps_avx(auVar130,auVar130,0);
    auVar159 = vshufps_avx(auVar130,auVar130,0x55);
    auVar113 = vshufps_avx(auVar109,auVar109,0);
    auVar158 = vshufps_avx(auVar109,auVar109,0x55);
    auVar92 = vshufps_avx(auVar242,auVar242,0);
    auVar131 = vshufps_avx(auVar242,auVar242,0x55);
    auVar90 = vshufps_avx(auVar151,auVar151,0);
    auVar105 = vshufps_avx(auVar151,auVar151,0x55);
    auVar114 = ZEXT416((uint)((auVar114._0_4_ - local_400._0_4_) * 0.04761905));
    auVar114 = vshufps_avx(auVar114,auVar114,0);
    auVar280._0_4_ = auVar204._0_4_ + auVar94._0_4_ * 0.0;
    auVar280._4_4_ = auVar204._4_4_ + auVar94._4_4_ * 0.14285715;
    auVar280._8_4_ = auVar204._8_4_ + auVar94._8_4_ * 0.2857143;
    auVar280._12_4_ = auVar204._12_4_ + auVar94._12_4_ * 0.42857146;
    auVar280._16_4_ = auVar204._0_4_ + auVar94._16_4_ * 0.5714286;
    auVar280._20_4_ = auVar204._4_4_ + auVar94._20_4_ * 0.71428573;
    auVar280._24_4_ = auVar204._8_4_ + auVar94._24_4_ * 0.8571429;
    auVar280._28_4_ = auVar204._12_4_ + auVar94._28_4_;
    auVar16 = vsubps_avx(auVar344,auVar280);
    fVar193 = auVar113._0_4_;
    fVar196 = auVar113._4_4_;
    fVar191 = auVar113._8_4_;
    fVar194 = auVar113._12_4_;
    fVar218 = auVar16._0_4_;
    fVar222 = auVar16._4_4_;
    fVar173 = auVar16._8_4_;
    fVar192 = auVar16._12_4_;
    fVar328 = auVar214._12_4_;
    fVar197 = auVar16._16_4_;
    fVar23 = auVar16._20_4_;
    fVar24 = auVar16._24_4_;
    fVar234 = auVar158._0_4_;
    fVar235 = auVar158._4_4_;
    fVar236 = auVar158._8_4_;
    fVar321 = auVar158._12_4_;
    local_5e0 = auVar159._0_4_;
    fStack_5dc = auVar159._4_4_;
    fStack_5d8 = auVar159._8_4_;
    fStack_5d4 = auVar159._12_4_;
    fVar219 = auVar92._0_4_;
    fVar221 = auVar92._4_4_;
    fVar171 = auVar92._8_4_;
    fVar174 = auVar92._12_4_;
    fVar195 = auVar280._0_4_ * fVar219 + fVar193 * fVar218;
    fVar301 = auVar280._4_4_ * fVar221 + fVar196 * fVar222;
    fVar302 = auVar280._8_4_ * fVar171 + fVar191 * fVar173;
    fVar303 = auVar280._12_4_ * fVar174 + fVar194 * fVar192;
    fVar304 = auVar280._16_4_ * fVar219 + fVar193 * fVar197;
    fVar305 = auVar280._20_4_ * fVar221 + fVar196 * fVar23;
    fVar306 = auVar280._24_4_ * fVar171 + fVar191 * fVar24;
    fVar220 = auVar131._0_4_;
    fVar145 = auVar131._4_4_;
    fVar172 = auVar131._8_4_;
    fVar177 = auVar131._12_4_;
    fVar307 = auVar280._0_4_ * fVar220 + fVar234 * fVar218;
    fVar312 = auVar280._4_4_ * fVar145 + fVar235 * fVar222;
    fVar313 = auVar280._8_4_ * fVar172 + fVar236 * fVar173;
    fVar314 = auVar280._12_4_ * fVar177 + fVar321 * fVar192;
    fVar315 = auVar280._16_4_ * fVar220 + fVar234 * fVar197;
    fVar317 = auVar280._20_4_ * fVar145 + fVar235 * fVar23;
    fVar319 = auVar280._24_4_ * fVar172 + fVar236 * fVar24;
    auVar204 = vshufps_avx(auVar130,auVar130,0xaa);
    auVar159 = vshufps_avx(auVar130,auVar130,0xff);
    fVar190 = fVar174 + 0.0;
    auVar113 = vshufps_avx(auVar109,auVar109,0xaa);
    auVar158 = vshufps_avx(auVar109,auVar109,0xff);
    auVar100._0_4_ =
         fVar218 * (fVar193 * auVar280._0_4_ + auVar214._0_4_ * fVar218) + auVar280._0_4_ * fVar195;
    auVar100._4_4_ =
         fVar222 * (fVar196 * auVar280._4_4_ + auVar214._4_4_ * fVar222) + auVar280._4_4_ * fVar301;
    auVar100._8_4_ =
         fVar173 * (fVar191 * auVar280._8_4_ + auVar214._8_4_ * fVar173) + auVar280._8_4_ * fVar302;
    auVar100._12_4_ =
         fVar192 * (fVar194 * auVar280._12_4_ + fVar328 * fVar192) + auVar280._12_4_ * fVar303;
    auVar100._16_4_ =
         fVar197 * (fVar193 * auVar280._16_4_ + auVar214._0_4_ * fVar197) +
         auVar280._16_4_ * fVar304;
    auVar100._20_4_ =
         fVar23 * (fVar196 * auVar280._20_4_ + auVar214._4_4_ * fVar23) + auVar280._20_4_ * fVar305;
    auVar100._24_4_ =
         fVar24 * (fVar191 * auVar280._24_4_ + auVar214._8_4_ * fVar24) + auVar280._24_4_ * fVar306;
    auVar100._28_4_ = fVar328 + 1.0 + fVar177;
    auVar167._0_4_ =
         fVar218 * (fVar234 * auVar280._0_4_ + fVar218 * local_5e0) + auVar280._0_4_ * fVar307;
    auVar167._4_4_ =
         fVar222 * (fVar235 * auVar280._4_4_ + fVar222 * fStack_5dc) + auVar280._4_4_ * fVar312;
    auVar167._8_4_ =
         fVar173 * (fVar236 * auVar280._8_4_ + fVar173 * fStack_5d8) + auVar280._8_4_ * fVar313;
    auVar167._12_4_ =
         fVar192 * (fVar321 * auVar280._12_4_ + fVar192 * fStack_5d4) + auVar280._12_4_ * fVar314;
    auVar167._16_4_ =
         fVar197 * (fVar234 * auVar280._16_4_ + fVar197 * local_5e0) + auVar280._16_4_ * fVar315;
    auVar167._20_4_ =
         fVar23 * (fVar235 * auVar280._20_4_ + fVar23 * fStack_5dc) + auVar280._20_4_ * fVar317;
    auVar167._24_4_ =
         fVar24 * (fVar236 * auVar280._24_4_ + fVar24 * fStack_5d8) + auVar280._24_4_ * fVar319;
    auVar167._28_4_ = fVar328 + 1.0 + fVar177;
    auVar187._0_4_ =
         fVar218 * fVar195 + auVar280._0_4_ * (auVar90._0_4_ * auVar280._0_4_ + fVar218 * fVar219);
    auVar187._4_4_ =
         fVar222 * fVar301 + auVar280._4_4_ * (auVar90._4_4_ * auVar280._4_4_ + fVar222 * fVar221);
    auVar187._8_4_ =
         fVar173 * fVar302 + auVar280._8_4_ * (auVar90._8_4_ * auVar280._8_4_ + fVar173 * fVar171);
    auVar187._12_4_ =
         fVar192 * fVar303 +
         auVar280._12_4_ * (auVar90._12_4_ * auVar280._12_4_ + fVar192 * fVar174);
    auVar187._16_4_ =
         fVar197 * fVar304 + auVar280._16_4_ * (auVar90._0_4_ * auVar280._16_4_ + fVar197 * fVar219)
    ;
    auVar187._20_4_ =
         fVar23 * fVar305 + auVar280._20_4_ * (auVar90._4_4_ * auVar280._20_4_ + fVar23 * fVar221);
    auVar187._24_4_ =
         fVar24 * fVar306 + auVar280._24_4_ * (auVar90._8_4_ * auVar280._24_4_ + fVar24 * fVar171);
    auVar187._28_4_ = fVar177 + fVar190;
    auVar290._0_4_ =
         fVar218 * fVar307 + auVar280._0_4_ * (auVar105._0_4_ * auVar280._0_4_ + fVar218 * fVar220);
    auVar290._4_4_ =
         fVar222 * fVar312 + auVar280._4_4_ * (auVar105._4_4_ * auVar280._4_4_ + fVar222 * fVar145);
    auVar290._8_4_ =
         fVar173 * fVar313 + auVar280._8_4_ * (auVar105._8_4_ * auVar280._8_4_ + fVar173 * fVar172);
    auVar290._12_4_ =
         fVar192 * fVar314 +
         auVar280._12_4_ * (auVar105._12_4_ * auVar280._12_4_ + fVar192 * fVar177);
    auVar290._16_4_ =
         fVar197 * fVar315 +
         auVar280._16_4_ * (auVar105._0_4_ * auVar280._16_4_ + fVar197 * fVar220);
    auVar290._20_4_ =
         fVar23 * fVar317 + auVar280._20_4_ * (auVar105._4_4_ * auVar280._20_4_ + fVar23 * fVar145);
    auVar290._24_4_ =
         fVar24 * fVar319 + auVar280._24_4_ * (auVar105._8_4_ * auVar280._24_4_ + fVar24 * fVar172);
    auVar290._28_4_ = fVar190 + fVar177 + 0.0;
    local_1c0._0_4_ = fVar218 * auVar100._0_4_ + auVar280._0_4_ * auVar187._0_4_;
    local_1c0._4_4_ = fVar222 * auVar100._4_4_ + auVar280._4_4_ * auVar187._4_4_;
    local_1c0._8_4_ = fVar173 * auVar100._8_4_ + auVar280._8_4_ * auVar187._8_4_;
    local_1c0._12_4_ = fVar192 * auVar100._12_4_ + auVar280._12_4_ * auVar187._12_4_;
    local_1c0._16_4_ = fVar197 * auVar100._16_4_ + auVar280._16_4_ * auVar187._16_4_;
    local_1c0._20_4_ = fVar23 * auVar100._20_4_ + auVar280._20_4_ * auVar187._20_4_;
    local_1c0._24_4_ = fVar24 * auVar100._24_4_ + auVar280._24_4_ * auVar187._24_4_;
    local_1c0._28_4_ = fVar328 + fVar194 + fVar177 + 0.0;
    local_1e0._0_4_ = fVar218 * auVar167._0_4_ + auVar280._0_4_ * auVar290._0_4_;
    local_1e0._4_4_ = fVar222 * auVar167._4_4_ + auVar280._4_4_ * auVar290._4_4_;
    local_1e0._8_4_ = fVar173 * auVar167._8_4_ + auVar280._8_4_ * auVar290._8_4_;
    local_1e0._12_4_ = fVar192 * auVar167._12_4_ + auVar280._12_4_ * auVar290._12_4_;
    local_1e0._16_4_ = fVar197 * auVar167._16_4_ + auVar280._16_4_ * auVar290._16_4_;
    local_1e0._20_4_ = fVar23 * auVar167._20_4_ + auVar280._20_4_ * auVar290._20_4_;
    local_1e0._24_4_ = fVar24 * auVar167._24_4_ + auVar280._24_4_ * auVar290._24_4_;
    local_1e0._28_4_ = fVar328 + fVar194 + fVar190;
    auVar17 = vsubps_avx(auVar187,auVar100);
    auVar94 = vsubps_avx(auVar290,auVar167);
    local_640 = auVar114._0_4_;
    fStack_63c = auVar114._4_4_;
    fStack_638 = auVar114._8_4_;
    fStack_634 = auVar114._12_4_;
    local_220 = local_640 * auVar17._0_4_ * 3.0;
    fStack_21c = fStack_63c * auVar17._4_4_ * 3.0;
    auVar27._4_4_ = fStack_21c;
    auVar27._0_4_ = local_220;
    fStack_218 = fStack_638 * auVar17._8_4_ * 3.0;
    auVar27._8_4_ = fStack_218;
    fStack_214 = fStack_634 * auVar17._12_4_ * 3.0;
    auVar27._12_4_ = fStack_214;
    fStack_210 = local_640 * auVar17._16_4_ * 3.0;
    auVar27._16_4_ = fStack_210;
    fStack_20c = fStack_63c * auVar17._20_4_ * 3.0;
    auVar27._20_4_ = fStack_20c;
    fStack_208 = fStack_638 * auVar17._24_4_ * 3.0;
    auVar27._24_4_ = fStack_208;
    auVar27._28_4_ = auVar17._28_4_;
    fVar301 = local_640 * auVar94._0_4_ * 3.0;
    fVar191 = fStack_63c * auVar94._4_4_ * 3.0;
    auVar28._4_4_ = fVar191;
    auVar28._0_4_ = fVar301;
    fVar302 = fStack_638 * auVar94._8_4_ * 3.0;
    auVar28._8_4_ = fVar302;
    fVar194 = fStack_634 * auVar94._12_4_ * 3.0;
    auVar28._12_4_ = fVar194;
    fVar303 = local_640 * auVar94._16_4_ * 3.0;
    auVar28._16_4_ = fVar303;
    fVar304 = fStack_63c * auVar94._20_4_ * 3.0;
    auVar28._20_4_ = fVar304;
    fVar305 = fStack_638 * auVar94._24_4_ * 3.0;
    auVar28._24_4_ = fVar305;
    auVar28._28_4_ = auVar187._28_4_;
    auVar15 = vsubps_avx(local_1c0,auVar27);
    auVar94 = vperm2f128_avx(auVar15,auVar15,1);
    auVar94 = vshufps_avx(auVar94,auVar15,0x30);
    auVar94 = vshufps_avx(auVar15,auVar94,0x29);
    auVar18 = vsubps_avx(local_1e0,auVar28);
    auVar15 = vperm2f128_avx(auVar18,auVar18,1);
    auVar15 = vshufps_avx(auVar15,auVar18,0x30);
    auVar19 = vshufps_avx(auVar18,auVar15,0x29);
    fVar330 = auVar113._0_4_;
    fVar335 = auVar113._4_4_;
    fVar336 = auVar113._8_4_;
    fVar219 = auVar158._0_4_;
    fVar145 = auVar158._4_4_;
    fVar174 = auVar158._8_4_;
    fVar193 = auVar158._12_4_;
    fVar329 = auVar159._12_4_;
    auVar114 = vshufps_avx(auVar242,auVar242,0xaa);
    fVar220 = auVar114._0_4_;
    fVar171 = auVar114._4_4_;
    fVar177 = auVar114._8_4_;
    fVar195 = auVar114._12_4_;
    fVar314 = auVar280._0_4_ * fVar220 + fVar330 * fVar218;
    fVar315 = auVar280._4_4_ * fVar171 + fVar335 * fVar222;
    fVar317 = auVar280._8_4_ * fVar177 + fVar336 * fVar173;
    fVar319 = auVar280._12_4_ * fVar195 + auVar113._12_4_ * fVar192;
    fVar316 = auVar280._16_4_ * fVar220 + fVar330 * fVar197;
    fVar318 = auVar280._20_4_ * fVar171 + fVar335 * fVar23;
    fVar320 = auVar280._24_4_ * fVar177 + fVar336 * fVar24;
    fVar321 = fVar329 + fVar328 + fVar321;
    auVar114 = vshufps_avx(auVar242,auVar242,0xff);
    fVar221 = auVar114._0_4_;
    fVar172 = auVar114._4_4_;
    fVar190 = auVar114._8_4_;
    fVar196 = auVar114._12_4_;
    fVar306 = auVar280._0_4_ * fVar221 + fVar218 * fVar219;
    fVar234 = auVar280._4_4_ * fVar172 + fVar222 * fVar145;
    fVar307 = auVar280._8_4_ * fVar190 + fVar173 * fVar174;
    fVar235 = auVar280._12_4_ * fVar196 + fVar192 * fVar193;
    fVar312 = auVar280._16_4_ * fVar221 + fVar197 * fVar219;
    fVar236 = auVar280._20_4_ * fVar172 + fVar23 * fVar145;
    fVar313 = auVar280._24_4_ * fVar190 + fVar24 * fVar174;
    auVar114 = vshufps_avx(auVar151,auVar151,0xaa);
    auVar214 = vshufps_avx(auVar151,auVar151,0xff);
    fVar328 = auVar214._12_4_;
    auVar101._0_4_ =
         auVar280._0_4_ * fVar314 + fVar218 * (fVar330 * auVar280._0_4_ + auVar204._0_4_ * fVar218);
    auVar101._4_4_ =
         auVar280._4_4_ * fVar315 + fVar222 * (fVar335 * auVar280._4_4_ + auVar204._4_4_ * fVar222);
    auVar101._8_4_ =
         auVar280._8_4_ * fVar317 + fVar173 * (fVar336 * auVar280._8_4_ + auVar204._8_4_ * fVar173);
    auVar101._12_4_ =
         auVar280._12_4_ * fVar319 +
         fVar192 * (auVar113._12_4_ * auVar280._12_4_ + auVar204._12_4_ * fVar192);
    auVar101._16_4_ =
         auVar280._16_4_ * fVar316 +
         fVar197 * (fVar330 * auVar280._16_4_ + auVar204._0_4_ * fVar197);
    auVar101._20_4_ =
         auVar280._20_4_ * fVar318 + fVar23 * (fVar335 * auVar280._20_4_ + auVar204._4_4_ * fVar23);
    auVar101._24_4_ =
         auVar280._24_4_ * fVar320 + fVar24 * (fVar336 * auVar280._24_4_ + auVar204._8_4_ * fVar24);
    auVar101._28_4_ = fVar328 + auVar18._28_4_ + auVar15._28_4_;
    auVar327._0_4_ =
         auVar280._0_4_ * fVar306 + fVar218 * (auVar280._0_4_ * fVar219 + auVar159._0_4_ * fVar218);
    auVar327._4_4_ =
         auVar280._4_4_ * fVar234 + fVar222 * (auVar280._4_4_ * fVar145 + auVar159._4_4_ * fVar222);
    auVar327._8_4_ =
         auVar280._8_4_ * fVar307 + fVar173 * (auVar280._8_4_ * fVar174 + auVar159._8_4_ * fVar173);
    auVar327._12_4_ =
         auVar280._12_4_ * fVar235 + fVar192 * (auVar280._12_4_ * fVar193 + fVar329 * fVar192);
    auVar327._16_4_ =
         auVar280._16_4_ * fVar312 +
         fVar197 * (auVar280._16_4_ * fVar219 + auVar159._0_4_ * fVar197);
    auVar327._20_4_ =
         auVar280._20_4_ * fVar236 + fVar23 * (auVar280._20_4_ * fVar145 + auVar159._4_4_ * fVar23);
    auVar327._24_4_ =
         auVar280._24_4_ * fVar313 + fVar24 * (auVar280._24_4_ * fVar174 + auVar159._8_4_ * fVar24);
    auVar327._28_4_ = fVar328 + auVar15._28_4_ + auVar187._28_4_;
    auVar15 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar15 = vshufps_avx(auVar15,local_1c0,0x30);
    auVar20 = vshufps_avx(local_1c0,auVar15,0x29);
    auVar188._0_4_ =
         fVar218 * fVar314 + auVar280._0_4_ * (auVar114._0_4_ * auVar280._0_4_ + fVar218 * fVar220);
    auVar188._4_4_ =
         fVar222 * fVar315 + auVar280._4_4_ * (auVar114._4_4_ * auVar280._4_4_ + fVar222 * fVar171);
    auVar188._8_4_ =
         fVar173 * fVar317 + auVar280._8_4_ * (auVar114._8_4_ * auVar280._8_4_ + fVar173 * fVar177);
    auVar188._12_4_ =
         fVar192 * fVar319 +
         auVar280._12_4_ * (auVar114._12_4_ * auVar280._12_4_ + fVar192 * fVar195);
    auVar188._16_4_ =
         fVar197 * fVar316 +
         auVar280._16_4_ * (auVar114._0_4_ * auVar280._16_4_ + fVar197 * fVar220);
    auVar188._20_4_ =
         fVar23 * fVar318 + auVar280._20_4_ * (auVar114._4_4_ * auVar280._20_4_ + fVar23 * fVar171);
    auVar188._24_4_ =
         fVar24 * fVar320 + auVar280._24_4_ * (auVar114._8_4_ * auVar280._24_4_ + fVar24 * fVar177);
    auVar188._28_4_ = fVar321 + auVar114._12_4_ + fVar195;
    auVar233._0_4_ =
         fVar218 * fVar306 + auVar280._0_4_ * (auVar214._0_4_ * auVar280._0_4_ + fVar218 * fVar221);
    auVar233._4_4_ =
         fVar222 * fVar234 + auVar280._4_4_ * (auVar214._4_4_ * auVar280._4_4_ + fVar222 * fVar172);
    auVar233._8_4_ =
         fVar173 * fVar307 + auVar280._8_4_ * (auVar214._8_4_ * auVar280._8_4_ + fVar173 * fVar190);
    auVar233._12_4_ =
         fVar192 * fVar235 + auVar280._12_4_ * (fVar328 * auVar280._12_4_ + fVar192 * fVar196);
    auVar233._16_4_ =
         fVar197 * fVar312 +
         auVar280._16_4_ * (auVar214._0_4_ * auVar280._16_4_ + fVar197 * fVar221);
    auVar233._20_4_ =
         fVar23 * fVar236 + auVar280._20_4_ * (auVar214._4_4_ * auVar280._20_4_ + fVar23 * fVar172);
    auVar233._24_4_ =
         fVar24 * fVar313 + auVar280._24_4_ * (auVar214._8_4_ * auVar280._24_4_ + fVar24 * fVar190);
    auVar233._28_4_ = fVar329 + fVar193 + fVar328 + fVar196;
    auVar249._0_4_ = fVar218 * auVar101._0_4_ + auVar280._0_4_ * auVar188._0_4_;
    auVar249._4_4_ = fVar222 * auVar101._4_4_ + auVar280._4_4_ * auVar188._4_4_;
    auVar249._8_4_ = fVar173 * auVar101._8_4_ + auVar280._8_4_ * auVar188._8_4_;
    auVar249._12_4_ = fVar192 * auVar101._12_4_ + auVar280._12_4_ * auVar188._12_4_;
    auVar249._16_4_ = fVar197 * auVar101._16_4_ + auVar280._16_4_ * auVar188._16_4_;
    auVar249._20_4_ = fVar23 * auVar101._20_4_ + auVar280._20_4_ * auVar188._20_4_;
    auVar249._24_4_ = fVar24 * auVar101._24_4_ + auVar280._24_4_ * auVar188._24_4_;
    auVar249._28_4_ = fVar321 + fVar328 + fVar196;
    auVar264._0_4_ = fVar218 * auVar327._0_4_ + auVar280._0_4_ * auVar233._0_4_;
    auVar264._4_4_ = fVar222 * auVar327._4_4_ + auVar280._4_4_ * auVar233._4_4_;
    auVar264._8_4_ = fVar173 * auVar327._8_4_ + auVar280._8_4_ * auVar233._8_4_;
    auVar264._12_4_ = fVar192 * auVar327._12_4_ + auVar280._12_4_ * auVar233._12_4_;
    auVar264._16_4_ = fVar197 * auVar327._16_4_ + auVar280._16_4_ * auVar233._16_4_;
    auVar264._20_4_ = fVar23 * auVar327._20_4_ + auVar280._20_4_ * auVar233._20_4_;
    auVar264._24_4_ = fVar24 * auVar327._24_4_ + auVar280._24_4_ * auVar233._24_4_;
    auVar264._28_4_ = auVar16._28_4_ + auVar280._28_4_;
    auVar15 = vsubps_avx(auVar188,auVar101);
    auVar16 = vsubps_avx(auVar233,auVar327);
    local_240 = local_640 * auVar15._0_4_ * 3.0;
    fStack_23c = fStack_63c * auVar15._4_4_ * 3.0;
    auVar29._4_4_ = fStack_23c;
    auVar29._0_4_ = local_240;
    fStack_238 = fStack_638 * auVar15._8_4_ * 3.0;
    auVar29._8_4_ = fStack_238;
    fStack_234 = fStack_634 * auVar15._12_4_ * 3.0;
    auVar29._12_4_ = fStack_234;
    fStack_230 = local_640 * auVar15._16_4_ * 3.0;
    auVar29._16_4_ = fStack_230;
    fStack_22c = fStack_63c * auVar15._20_4_ * 3.0;
    auVar29._20_4_ = fStack_22c;
    fStack_228 = fStack_638 * auVar15._24_4_ * 3.0;
    auVar29._24_4_ = fStack_228;
    auVar29._28_4_ = auVar233._28_4_;
    local_260 = local_640 * auVar16._0_4_ * 3.0;
    fStack_25c = fStack_63c * auVar16._4_4_ * 3.0;
    auVar30._4_4_ = fStack_25c;
    auVar30._0_4_ = local_260;
    fStack_258 = fStack_638 * auVar16._8_4_ * 3.0;
    auVar30._8_4_ = fStack_258;
    fStack_254 = fStack_634 * auVar16._12_4_ * 3.0;
    auVar30._12_4_ = fStack_254;
    local_640 = local_640 * auVar16._16_4_ * 3.0;
    auVar30._16_4_ = local_640;
    fStack_63c = fStack_63c * auVar16._20_4_ * 3.0;
    auVar30._20_4_ = fStack_63c;
    fStack_638 = fStack_638 * auVar16._24_4_ * 3.0;
    auVar30._24_4_ = fStack_638;
    auVar30._28_4_ = fStack_634;
    auVar15 = vperm2f128_avx(auVar249,auVar249,1);
    auVar15 = vshufps_avx(auVar15,auVar249,0x30);
    auVar21 = vshufps_avx(auVar249,auVar15,0x29);
    auVar16 = vsubps_avx(auVar249,auVar29);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar22 = vshufps_avx(auVar16,auVar15,0x29);
    auVar16 = vsubps_avx(auVar264,auVar30);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar25 = vshufps_avx(auVar16,auVar15,0x29);
    auVar18 = vsubps_avx(auVar249,local_1c0);
    auVar95 = vsubps_avx(auVar21,auVar20);
    fVar218 = auVar95._0_4_ + auVar18._0_4_;
    fVar219 = auVar95._4_4_ + auVar18._4_4_;
    fVar220 = auVar95._8_4_ + auVar18._8_4_;
    fVar221 = auVar95._12_4_ + auVar18._12_4_;
    fVar222 = auVar95._16_4_ + auVar18._16_4_;
    fVar145 = auVar95._20_4_ + auVar18._20_4_;
    fVar171 = auVar95._24_4_ + auVar18._24_4_;
    auVar16 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar16 = vshufps_avx(auVar16,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar264,auVar264,1);
    auVar16 = vshufps_avx(auVar16,auVar264,0x30);
    auVar26 = vshufps_avx(auVar264,auVar16,0x29);
    auVar16 = vsubps_avx(auVar264,local_1e0);
    auVar96 = vsubps_avx(auVar26,local_200);
    fVar172 = auVar16._0_4_ + auVar96._0_4_;
    fVar173 = auVar16._4_4_ + auVar96._4_4_;
    fVar174 = auVar16._8_4_ + auVar96._8_4_;
    fVar177 = auVar16._12_4_ + auVar96._12_4_;
    fVar190 = auVar16._16_4_ + auVar96._16_4_;
    fVar192 = auVar16._20_4_ + auVar96._20_4_;
    fVar193 = auVar16._24_4_ + auVar96._24_4_;
    fVar195 = auVar16._28_4_;
    auVar31._4_4_ = local_1e0._4_4_ * fVar219;
    auVar31._0_4_ = local_1e0._0_4_ * fVar218;
    auVar31._8_4_ = local_1e0._8_4_ * fVar220;
    auVar31._12_4_ = local_1e0._12_4_ * fVar221;
    auVar31._16_4_ = local_1e0._16_4_ * fVar222;
    auVar31._20_4_ = local_1e0._20_4_ * fVar145;
    auVar31._24_4_ = local_1e0._24_4_ * fVar171;
    auVar31._28_4_ = fVar195;
    auVar32._4_4_ = fVar173 * local_1c0._4_4_;
    auVar32._0_4_ = fVar172 * local_1c0._0_4_;
    auVar32._8_4_ = fVar174 * local_1c0._8_4_;
    auVar32._12_4_ = fVar177 * local_1c0._12_4_;
    auVar32._16_4_ = fVar190 * local_1c0._16_4_;
    auVar32._20_4_ = fVar192 * local_1c0._20_4_;
    auVar32._24_4_ = fVar193 * local_1c0._24_4_;
    auVar32._28_4_ = auVar15._28_4_;
    auVar16 = vsubps_avx(auVar31,auVar32);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar17._28_4_;
    fVar301 = local_1e0._0_4_ + fVar301;
    fVar191 = local_1e0._4_4_ + fVar191;
    fVar302 = local_1e0._8_4_ + fVar302;
    fVar194 = local_1e0._12_4_ + fVar194;
    fVar303 = local_1e0._16_4_ + fVar303;
    fVar304 = local_1e0._20_4_ + fVar304;
    fVar305 = local_1e0._24_4_ + fVar305;
    auVar33._4_4_ = fVar191 * fVar219;
    auVar33._0_4_ = fVar301 * fVar218;
    auVar33._8_4_ = fVar302 * fVar220;
    auVar33._12_4_ = fVar194 * fVar221;
    auVar33._16_4_ = fVar303 * fVar222;
    auVar33._20_4_ = fVar304 * fVar145;
    auVar33._24_4_ = fVar305 * fVar171;
    auVar33._28_4_ = fVar195;
    auVar34._4_4_ = fVar173 * fStack_21c;
    auVar34._0_4_ = fVar172 * local_220;
    auVar34._8_4_ = fVar174 * fStack_218;
    auVar34._12_4_ = fVar177 * fStack_214;
    auVar34._16_4_ = fVar190 * fStack_210;
    auVar34._20_4_ = fVar192 * fStack_20c;
    auVar34._24_4_ = fVar193 * fStack_208;
    auVar34._28_4_ = fStack_204;
    auVar17 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar19._4_4_ * fVar219;
    auVar35._0_4_ = auVar19._0_4_ * fVar218;
    auVar35._8_4_ = auVar19._8_4_ * fVar220;
    auVar35._12_4_ = auVar19._12_4_ * fVar221;
    auVar35._16_4_ = auVar19._16_4_ * fVar222;
    auVar35._20_4_ = auVar19._20_4_ * fVar145;
    auVar35._24_4_ = auVar19._24_4_ * fVar171;
    auVar35._28_4_ = fVar195;
    local_5e0 = auVar94._0_4_;
    fStack_5dc = auVar94._4_4_;
    fStack_5d8 = auVar94._8_4_;
    fStack_5d4 = auVar94._12_4_;
    fStack_5d0 = auVar94._16_4_;
    fStack_5cc = auVar94._20_4_;
    fStack_5c8 = auVar94._24_4_;
    auVar36._4_4_ = fVar173 * fStack_5dc;
    auVar36._0_4_ = fVar172 * local_5e0;
    auVar36._8_4_ = fVar174 * fStack_5d8;
    auVar36._12_4_ = fVar177 * fStack_5d4;
    auVar36._16_4_ = fVar190 * fStack_5d0;
    auVar36._20_4_ = fVar192 * fStack_5cc;
    auVar36._24_4_ = fVar193 * fStack_5c8;
    auVar36._28_4_ = 0x40400000;
    auVar97 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = local_200._4_4_ * fVar219;
    auVar37._0_4_ = local_200._0_4_ * fVar218;
    auVar37._8_4_ = local_200._8_4_ * fVar220;
    auVar37._12_4_ = local_200._12_4_ * fVar221;
    auVar37._16_4_ = local_200._16_4_ * fVar222;
    auVar37._20_4_ = local_200._20_4_ * fVar145;
    auVar37._24_4_ = local_200._24_4_ * fVar171;
    auVar37._28_4_ = fVar195;
    auVar38._4_4_ = auVar20._4_4_ * fVar173;
    auVar38._0_4_ = auVar20._0_4_ * fVar172;
    auVar38._8_4_ = auVar20._8_4_ * fVar174;
    auVar38._12_4_ = auVar20._12_4_ * fVar177;
    auVar38._16_4_ = auVar20._16_4_ * fVar190;
    auVar38._20_4_ = auVar20._20_4_ * fVar192;
    auVar38._24_4_ = auVar20._24_4_ * fVar193;
    auVar38._28_4_ = local_200._28_4_;
    auVar123 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = auVar264._4_4_ * fVar219;
    auVar39._0_4_ = auVar264._0_4_ * fVar218;
    auVar39._8_4_ = auVar264._8_4_ * fVar220;
    auVar39._12_4_ = auVar264._12_4_ * fVar221;
    auVar39._16_4_ = auVar264._16_4_ * fVar222;
    auVar39._20_4_ = auVar264._20_4_ * fVar145;
    auVar39._24_4_ = auVar264._24_4_ * fVar171;
    auVar39._28_4_ = fVar195;
    auVar40._4_4_ = fVar173 * auVar249._4_4_;
    auVar40._0_4_ = fVar172 * auVar249._0_4_;
    auVar40._8_4_ = fVar174 * auVar249._8_4_;
    auVar40._12_4_ = fVar177 * auVar249._12_4_;
    auVar40._16_4_ = fVar190 * auVar249._16_4_;
    auVar40._20_4_ = fVar192 * auVar249._20_4_;
    auVar40._24_4_ = fVar193 * auVar249._24_4_;
    auVar40._28_4_ = auVar19._28_4_;
    auVar124 = vsubps_avx(auVar39,auVar40);
    local_240 = auVar249._0_4_ + local_240;
    fStack_23c = auVar249._4_4_ + fStack_23c;
    fStack_238 = auVar249._8_4_ + fStack_238;
    fStack_234 = auVar249._12_4_ + fStack_234;
    fStack_230 = auVar249._16_4_ + fStack_230;
    fStack_22c = auVar249._20_4_ + fStack_22c;
    fStack_228 = auVar249._24_4_ + fStack_228;
    fStack_224 = auVar249._28_4_ + auVar233._28_4_;
    local_260 = auVar264._0_4_ + local_260;
    fStack_25c = auVar264._4_4_ + fStack_25c;
    fStack_258 = auVar264._8_4_ + fStack_258;
    fStack_254 = auVar264._12_4_ + fStack_254;
    fStack_250 = auVar264._16_4_ + local_640;
    fStack_24c = auVar264._20_4_ + fStack_63c;
    fStack_248 = auVar264._24_4_ + fStack_638;
    fStack_244 = auVar264._28_4_ + fStack_634;
    auVar41._4_4_ = fStack_25c * fVar219;
    auVar41._0_4_ = local_260 * fVar218;
    auVar41._8_4_ = fStack_258 * fVar220;
    auVar41._12_4_ = fStack_254 * fVar221;
    auVar41._16_4_ = fStack_250 * fVar222;
    auVar41._20_4_ = fStack_24c * fVar145;
    auVar41._24_4_ = fStack_248 * fVar171;
    auVar41._28_4_ = auVar264._28_4_ + fStack_634;
    auVar42._4_4_ = fStack_23c * fVar173;
    auVar42._0_4_ = local_240 * fVar172;
    auVar42._8_4_ = fStack_238 * fVar174;
    auVar42._12_4_ = fStack_234 * fVar177;
    auVar42._16_4_ = fStack_230 * fVar190;
    auVar42._20_4_ = fStack_22c * fVar192;
    auVar42._24_4_ = fStack_228 * fVar193;
    auVar42._28_4_ = fStack_224;
    auVar125 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = auVar25._4_4_ * fVar219;
    auVar43._0_4_ = auVar25._0_4_ * fVar218;
    auVar43._8_4_ = auVar25._8_4_ * fVar220;
    auVar43._12_4_ = auVar25._12_4_ * fVar221;
    auVar43._16_4_ = auVar25._16_4_ * fVar222;
    auVar43._20_4_ = auVar25._20_4_ * fVar145;
    auVar43._24_4_ = auVar25._24_4_ * fVar171;
    auVar43._28_4_ = fStack_224;
    auVar44._4_4_ = fVar173 * auVar22._4_4_;
    auVar44._0_4_ = fVar172 * auVar22._0_4_;
    auVar44._8_4_ = fVar174 * auVar22._8_4_;
    auVar44._12_4_ = fVar177 * auVar22._12_4_;
    auVar44._16_4_ = fVar190 * auVar22._16_4_;
    auVar44._20_4_ = fVar192 * auVar22._20_4_;
    auVar44._24_4_ = fVar193 * auVar22._24_4_;
    auVar44._28_4_ = auVar22._28_4_;
    auVar138 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = auVar26._4_4_ * fVar219;
    auVar45._0_4_ = auVar26._0_4_ * fVar218;
    auVar45._8_4_ = auVar26._8_4_ * fVar220;
    auVar45._12_4_ = auVar26._12_4_ * fVar221;
    auVar45._16_4_ = auVar26._16_4_ * fVar222;
    auVar45._20_4_ = auVar26._20_4_ * fVar145;
    auVar45._24_4_ = auVar26._24_4_ * fVar171;
    auVar45._28_4_ = auVar95._28_4_ + auVar18._28_4_;
    auVar46._4_4_ = auVar21._4_4_ * fVar173;
    auVar46._0_4_ = auVar21._0_4_ * fVar172;
    auVar46._8_4_ = auVar21._8_4_ * fVar174;
    auVar46._12_4_ = auVar21._12_4_ * fVar177;
    auVar46._16_4_ = auVar21._16_4_ * fVar190;
    auVar46._20_4_ = auVar21._20_4_ * fVar192;
    auVar46._24_4_ = auVar21._24_4_ * fVar193;
    auVar46._28_4_ = fVar195 + auVar96._28_4_;
    auVar95 = vsubps_avx(auVar45,auVar46);
    auVar15 = vminps_avx(auVar16,auVar17);
    auVar94 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar97,auVar123);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar97,auVar123);
    auVar94 = vmaxps_avx(auVar94,auVar15);
    auVar17 = vminps_avx(auVar124,auVar125);
    auVar15 = vmaxps_avx(auVar124,auVar125);
    auVar18 = vminps_avx(auVar138,auVar95);
    auVar17 = vminps_avx(auVar17,auVar18);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar138,auVar95);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar94,auVar15);
    auVar94 = vcmpps_avx(auVar17,local_280,2);
    auVar15 = vcmpps_avx(auVar15,local_2a0,5);
    auVar94 = vandps_avx(auVar15,auVar94);
    auVar15 = local_340 & auVar94;
    uVar85 = 0;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(auVar20,local_1c0);
      auVar16 = vsubps_avx(auVar21,auVar249);
      fVar219 = auVar15._0_4_ + auVar16._0_4_;
      fVar220 = auVar15._4_4_ + auVar16._4_4_;
      fVar221 = auVar15._8_4_ + auVar16._8_4_;
      fVar222 = auVar15._12_4_ + auVar16._12_4_;
      fVar145 = auVar15._16_4_ + auVar16._16_4_;
      fVar171 = auVar15._20_4_ + auVar16._20_4_;
      fVar172 = auVar15._24_4_ + auVar16._24_4_;
      auVar17 = vsubps_avx(local_200,local_1e0);
      auVar18 = vsubps_avx(auVar26,auVar264);
      fVar173 = auVar17._0_4_ + auVar18._0_4_;
      fVar174 = auVar17._4_4_ + auVar18._4_4_;
      fVar177 = auVar17._8_4_ + auVar18._8_4_;
      fVar190 = auVar17._12_4_ + auVar18._12_4_;
      fVar192 = auVar17._16_4_ + auVar18._16_4_;
      fVar193 = auVar17._20_4_ + auVar18._20_4_;
      fVar195 = auVar17._24_4_ + auVar18._24_4_;
      fVar218 = auVar18._28_4_;
      auVar47._4_4_ = local_1e0._4_4_ * fVar220;
      auVar47._0_4_ = local_1e0._0_4_ * fVar219;
      auVar47._8_4_ = local_1e0._8_4_ * fVar221;
      auVar47._12_4_ = local_1e0._12_4_ * fVar222;
      auVar47._16_4_ = local_1e0._16_4_ * fVar145;
      auVar47._20_4_ = local_1e0._20_4_ * fVar171;
      auVar47._24_4_ = local_1e0._24_4_ * fVar172;
      auVar47._28_4_ = local_1e0._28_4_;
      auVar48._4_4_ = local_1c0._4_4_ * fVar174;
      auVar48._0_4_ = local_1c0._0_4_ * fVar173;
      auVar48._8_4_ = local_1c0._8_4_ * fVar177;
      auVar48._12_4_ = local_1c0._12_4_ * fVar190;
      auVar48._16_4_ = local_1c0._16_4_ * fVar192;
      auVar48._20_4_ = local_1c0._20_4_ * fVar193;
      auVar48._24_4_ = local_1c0._24_4_ * fVar195;
      auVar48._28_4_ = local_1c0._28_4_;
      auVar18 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar191 * fVar220;
      auVar49._0_4_ = fVar301 * fVar219;
      auVar49._8_4_ = fVar302 * fVar221;
      auVar49._12_4_ = fVar194 * fVar222;
      auVar49._16_4_ = fVar303 * fVar145;
      auVar49._20_4_ = fVar304 * fVar171;
      auVar49._24_4_ = fVar305 * fVar172;
      auVar49._28_4_ = local_1e0._28_4_;
      auVar50._4_4_ = fVar174 * fStack_21c;
      auVar50._0_4_ = fVar173 * local_220;
      auVar50._8_4_ = fVar177 * fStack_218;
      auVar50._12_4_ = fVar190 * fStack_214;
      auVar50._16_4_ = fVar192 * fStack_210;
      auVar50._20_4_ = fVar193 * fStack_20c;
      auVar50._24_4_ = fVar195 * fStack_208;
      auVar50._28_4_ = fVar218;
      auVar95 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar220 * auVar19._4_4_;
      auVar51._0_4_ = fVar219 * auVar19._0_4_;
      auVar51._8_4_ = fVar221 * auVar19._8_4_;
      auVar51._12_4_ = fVar222 * auVar19._12_4_;
      auVar51._16_4_ = fVar145 * auVar19._16_4_;
      auVar51._20_4_ = fVar171 * auVar19._20_4_;
      auVar51._24_4_ = fVar172 * auVar19._24_4_;
      auVar51._28_4_ = fVar218;
      auVar52._4_4_ = fVar174 * fStack_5dc;
      auVar52._0_4_ = fVar173 * local_5e0;
      auVar52._8_4_ = fVar177 * fStack_5d8;
      auVar52._12_4_ = fVar190 * fStack_5d4;
      auVar52._16_4_ = fVar192 * fStack_5d0;
      auVar52._20_4_ = fVar193 * fStack_5cc;
      auVar52._24_4_ = fVar195 * fStack_5c8;
      auVar52._28_4_ = local_1e0._28_4_ + auVar187._28_4_;
      auVar19 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = local_200._4_4_ * fVar220;
      auVar53._0_4_ = local_200._0_4_ * fVar219;
      auVar53._8_4_ = local_200._8_4_ * fVar221;
      auVar53._12_4_ = local_200._12_4_ * fVar222;
      auVar53._16_4_ = local_200._16_4_ * fVar145;
      auVar53._20_4_ = local_200._20_4_ * fVar171;
      auVar53._24_4_ = local_200._24_4_ * fVar172;
      auVar53._28_4_ = local_1e0._28_4_ + auVar187._28_4_;
      auVar54._4_4_ = auVar20._4_4_ * fVar174;
      auVar54._0_4_ = auVar20._0_4_ * fVar173;
      auVar54._8_4_ = auVar20._8_4_ * fVar177;
      auVar54._12_4_ = auVar20._12_4_ * fVar190;
      auVar54._16_4_ = auVar20._16_4_ * fVar192;
      auVar54._20_4_ = auVar20._20_4_ * fVar193;
      uVar2 = auVar20._28_4_;
      auVar54._24_4_ = auVar20._24_4_ * fVar195;
      auVar54._28_4_ = uVar2;
      auVar20 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = auVar264._4_4_ * fVar220;
      auVar55._0_4_ = auVar264._0_4_ * fVar219;
      auVar55._8_4_ = auVar264._8_4_ * fVar221;
      auVar55._12_4_ = auVar264._12_4_ * fVar222;
      auVar55._16_4_ = auVar264._16_4_ * fVar145;
      auVar55._20_4_ = auVar264._20_4_ * fVar171;
      auVar55._24_4_ = auVar264._24_4_ * fVar172;
      auVar55._28_4_ = auVar264._28_4_;
      auVar56._4_4_ = auVar249._4_4_ * fVar174;
      auVar56._0_4_ = auVar249._0_4_ * fVar173;
      auVar56._8_4_ = auVar249._8_4_ * fVar177;
      auVar56._12_4_ = auVar249._12_4_ * fVar190;
      auVar56._16_4_ = auVar249._16_4_ * fVar192;
      auVar56._20_4_ = auVar249._20_4_ * fVar193;
      auVar56._24_4_ = auVar249._24_4_ * fVar195;
      auVar56._28_4_ = auVar249._28_4_;
      auVar96 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar220 * fStack_25c;
      auVar57._0_4_ = fVar219 * local_260;
      auVar57._8_4_ = fVar221 * fStack_258;
      auVar57._12_4_ = fVar222 * fStack_254;
      auVar57._16_4_ = fVar145 * fStack_250;
      auVar57._20_4_ = fVar171 * fStack_24c;
      auVar57._24_4_ = fVar172 * fStack_248;
      auVar57._28_4_ = auVar264._28_4_;
      auVar58._4_4_ = fVar174 * fStack_23c;
      auVar58._0_4_ = fVar173 * local_240;
      auVar58._8_4_ = fVar177 * fStack_238;
      auVar58._12_4_ = fVar190 * fStack_234;
      auVar58._16_4_ = fVar192 * fStack_230;
      auVar58._20_4_ = fVar193 * fStack_22c;
      auVar58._24_4_ = fVar195 * fStack_228;
      auVar58._28_4_ = uVar2;
      auVar97 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar220 * auVar25._4_4_;
      auVar59._0_4_ = fVar219 * auVar25._0_4_;
      auVar59._8_4_ = fVar221 * auVar25._8_4_;
      auVar59._12_4_ = fVar222 * auVar25._12_4_;
      auVar59._16_4_ = fVar145 * auVar25._16_4_;
      auVar59._20_4_ = fVar171 * auVar25._20_4_;
      auVar59._24_4_ = fVar172 * auVar25._24_4_;
      auVar59._28_4_ = uVar2;
      auVar60._4_4_ = fVar174 * auVar22._4_4_;
      auVar60._0_4_ = fVar173 * auVar22._0_4_;
      auVar60._8_4_ = fVar177 * auVar22._8_4_;
      auVar60._12_4_ = fVar190 * auVar22._12_4_;
      auVar60._16_4_ = fVar192 * auVar22._16_4_;
      auVar60._20_4_ = fVar193 * auVar22._20_4_;
      auVar60._24_4_ = fVar195 * auVar22._24_4_;
      auVar60._28_4_ = local_200._28_4_;
      auVar22 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = auVar26._4_4_ * fVar220;
      auVar61._0_4_ = auVar26._0_4_ * fVar219;
      auVar61._8_4_ = auVar26._8_4_ * fVar221;
      auVar61._12_4_ = auVar26._12_4_ * fVar222;
      auVar61._16_4_ = auVar26._16_4_ * fVar145;
      auVar61._20_4_ = auVar26._20_4_ * fVar171;
      auVar61._24_4_ = auVar26._24_4_ * fVar172;
      auVar61._28_4_ = auVar15._28_4_ + auVar16._28_4_;
      auVar62._4_4_ = auVar21._4_4_ * fVar174;
      auVar62._0_4_ = auVar21._0_4_ * fVar173;
      auVar62._8_4_ = auVar21._8_4_ * fVar177;
      auVar62._12_4_ = auVar21._12_4_ * fVar190;
      auVar62._16_4_ = auVar21._16_4_ * fVar192;
      auVar62._20_4_ = auVar21._20_4_ * fVar193;
      auVar62._24_4_ = auVar21._24_4_ * fVar195;
      auVar62._28_4_ = auVar17._28_4_ + fVar218;
      auVar21 = vsubps_avx(auVar61,auVar62);
      auVar16 = vminps_avx(auVar18,auVar95);
      auVar15 = vmaxps_avx(auVar18,auVar95);
      auVar17 = vminps_avx(auVar19,auVar20);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar19,auVar20);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar18 = vminps_avx(auVar96,auVar97);
      auVar16 = vmaxps_avx(auVar96,auVar97);
      auVar19 = vminps_avx(auVar22,auVar21);
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar22,auVar21);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vcmpps_avx(auVar18,local_280,2);
      auVar16 = vcmpps_avx(auVar16,local_2a0,5);
      auVar15 = vandps_avx(auVar16,auVar15);
      auVar94 = vandps_avx(auVar94,local_340);
      auVar16 = auVar94 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar15,auVar94);
        uVar85 = vmovmskps_avx(auVar94);
      }
    }
    if (uVar85 != 0) {
      auStack_480[uVar87] = uVar85;
      uVar3 = vmovlps_avx(local_400);
      *(undefined8 *)(afStack_320 + uVar87 * 2) = uVar3;
      uVar4 = vmovlps_avx(_local_6c0);
      auStack_1a0[uVar87] = uVar4;
      uVar87 = (ulong)((int)uVar87 + 1);
    }
    auVar334 = ZEXT864(0) << 0x20;
    auVar345 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
    do {
      if ((int)uVar87 == 0) {
        if (bVar79) {
          return local_711;
        }
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar104._4_4_ = uVar2;
        auVar104._0_4_ = uVar2;
        auVar104._8_4_ = uVar2;
        auVar104._12_4_ = uVar2;
        auVar104._16_4_ = uVar2;
        auVar104._20_4_ = uVar2;
        auVar104._24_4_ = uVar2;
        auVar104._28_4_ = uVar2;
        auVar94 = vcmpps_avx(local_2c0,auVar104,2);
        uVar80 = vmovmskps_avx(auVar94);
        uVar80 = (uint)uVar88 & uVar80;
        local_711 = uVar80 != 0;
        if (!local_711) {
          return local_711;
        }
        goto LAB_01173044;
      }
      uVar83 = (int)uVar87 - 1;
      uVar84 = (ulong)uVar83;
      uVar85 = auStack_480[uVar84];
      fVar218 = afStack_320[uVar84 * 2];
      fVar219 = afStack_320[uVar84 * 2 + 1];
      register0x00001508 = 0;
      local_6c0 = (undefined1  [8])auStack_1a0[uVar84];
      uVar4 = 0;
      if (uVar85 != 0) {
        for (; (uVar85 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar85 = uVar85 - 1 & uVar85;
      auStack_480[uVar84] = uVar85;
      if (uVar85 == 0) {
        uVar87 = (ulong)uVar83;
      }
      fVar221 = (float)(uVar4 + 1) * 0.14285715;
      fVar220 = (1.0 - (float)uVar4 * 0.14285715) * fVar218 + fVar219 * (float)uVar4 * 0.14285715;
      fVar218 = (1.0 - fVar221) * fVar218 + fVar219 * fVar221;
      fVar219 = fVar218 - fVar220;
      if (0.16666667 <= fVar219) break;
      auVar114 = vshufps_avx(_local_6c0,_local_6c0,0x50);
      auVar204 = vsubps_avx(auVar345._0_16_,auVar114);
      fVar221 = auVar114._0_4_;
      fVar222 = auVar114._4_4_;
      fVar145 = auVar114._8_4_;
      fVar171 = auVar114._12_4_;
      fVar172 = auVar204._0_4_;
      fVar173 = auVar204._4_4_;
      fVar174 = auVar204._8_4_;
      fVar177 = auVar204._12_4_;
      auVar152._0_4_ = auVar283._0_4_ * fVar221 + fVar172 * auVar309._0_4_;
      auVar152._4_4_ = auVar283._4_4_ * fVar222 + fVar173 * auVar309._4_4_;
      auVar152._8_4_ = auVar283._0_4_ * fVar145 + fVar174 * auVar309._0_4_;
      auVar152._12_4_ = auVar283._4_4_ * fVar171 + fVar177 * auVar309._4_4_;
      auVar179._0_4_ = auVar270._0_4_ * fVar221 + fVar175 * fVar172;
      auVar179._4_4_ = auVar270._4_4_ * fVar222 + fVar176 * fVar173;
      auVar179._8_4_ = auVar270._0_4_ * fVar145 + fVar175 * fVar174;
      auVar179._12_4_ = auVar270._4_4_ * fVar171 + fVar176 * fVar177;
      auVar207._0_4_ = auVar252._0_4_ * fVar221 + auVar331._0_4_ * fVar172;
      auVar207._4_4_ = auVar252._4_4_ * fVar222 + auVar331._4_4_ * fVar173;
      auVar207._8_4_ = auVar252._0_4_ * fVar145 + auVar331._0_4_ * fVar174;
      auVar207._12_4_ = auVar252._4_4_ * fVar171 + auVar331._4_4_ * fVar177;
      auVar110._0_4_ = auVar241._0_4_ * fVar221 + fVar172 * (float)local_490._0_4_;
      auVar110._4_4_ = auVar241._4_4_ * fVar222 + fVar173 * (float)local_490._4_4_;
      auVar110._8_4_ = auVar241._0_4_ * fVar145 + fVar174 * fStack_488;
      auVar110._12_4_ = auVar241._4_4_ * fVar171 + fVar177 * fStack_484;
      auVar141._16_16_ = auVar152;
      auVar141._0_16_ = auVar152;
      auVar168._16_16_ = auVar179;
      auVar168._0_16_ = auVar179;
      auVar189._16_16_ = auVar207;
      auVar189._0_16_ = auVar207;
      auVar94 = vshufps_avx(ZEXT2032(CONCAT416(fVar218,ZEXT416((uint)fVar220))),
                            ZEXT2032(CONCAT416(fVar218,ZEXT416((uint)fVar220))),0);
      auVar15 = vsubps_avx(auVar168,auVar141);
      fVar221 = auVar94._0_4_;
      fVar222 = auVar94._4_4_;
      fVar145 = auVar94._8_4_;
      fVar171 = auVar94._12_4_;
      fVar172 = auVar94._16_4_;
      fVar173 = auVar94._20_4_;
      fVar174 = auVar94._24_4_;
      auVar142._0_4_ = auVar152._0_4_ + auVar15._0_4_ * fVar221;
      auVar142._4_4_ = auVar152._4_4_ + auVar15._4_4_ * fVar222;
      auVar142._8_4_ = auVar152._8_4_ + auVar15._8_4_ * fVar145;
      auVar142._12_4_ = auVar152._12_4_ + auVar15._12_4_ * fVar171;
      auVar142._16_4_ = auVar152._0_4_ + auVar15._16_4_ * fVar172;
      auVar142._20_4_ = auVar152._4_4_ + auVar15._20_4_ * fVar173;
      auVar142._24_4_ = auVar152._8_4_ + auVar15._24_4_ * fVar174;
      auVar142._28_4_ = auVar152._12_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar189,auVar168);
      auVar169._0_4_ = auVar179._0_4_ + auVar15._0_4_ * fVar221;
      auVar169._4_4_ = auVar179._4_4_ + auVar15._4_4_ * fVar222;
      auVar169._8_4_ = auVar179._8_4_ + auVar15._8_4_ * fVar145;
      auVar169._12_4_ = auVar179._12_4_ + auVar15._12_4_ * fVar171;
      auVar169._16_4_ = auVar179._0_4_ + auVar15._16_4_ * fVar172;
      auVar169._20_4_ = auVar179._4_4_ + auVar15._20_4_ * fVar173;
      auVar169._24_4_ = auVar179._8_4_ + auVar15._24_4_ * fVar174;
      auVar169._28_4_ = auVar179._12_4_ + auVar15._28_4_;
      auVar114 = vsubps_avx(auVar110,auVar207);
      auVar126._0_4_ = auVar207._0_4_ + auVar114._0_4_ * fVar221;
      auVar126._4_4_ = auVar207._4_4_ + auVar114._4_4_ * fVar222;
      auVar126._8_4_ = auVar207._8_4_ + auVar114._8_4_ * fVar145;
      auVar126._12_4_ = auVar207._12_4_ + auVar114._12_4_ * fVar171;
      auVar126._16_4_ = auVar207._0_4_ + auVar114._0_4_ * fVar172;
      auVar126._20_4_ = auVar207._4_4_ + auVar114._4_4_ * fVar173;
      auVar126._24_4_ = auVar207._8_4_ + auVar114._8_4_ * fVar174;
      auVar126._28_4_ = auVar207._12_4_ + auVar114._12_4_;
      auVar15 = vsubps_avx(auVar169,auVar142);
      auVar143._0_4_ = auVar142._0_4_ + fVar221 * auVar15._0_4_;
      auVar143._4_4_ = auVar142._4_4_ + fVar222 * auVar15._4_4_;
      auVar143._8_4_ = auVar142._8_4_ + fVar145 * auVar15._8_4_;
      auVar143._12_4_ = auVar142._12_4_ + fVar171 * auVar15._12_4_;
      auVar143._16_4_ = auVar142._16_4_ + fVar172 * auVar15._16_4_;
      auVar143._20_4_ = auVar142._20_4_ + fVar173 * auVar15._20_4_;
      auVar143._24_4_ = auVar142._24_4_ + fVar174 * auVar15._24_4_;
      auVar143._28_4_ = auVar142._28_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar126,auVar169);
      auVar127._0_4_ = auVar169._0_4_ + fVar221 * auVar15._0_4_;
      auVar127._4_4_ = auVar169._4_4_ + fVar222 * auVar15._4_4_;
      auVar127._8_4_ = auVar169._8_4_ + fVar145 * auVar15._8_4_;
      auVar127._12_4_ = auVar169._12_4_ + fVar171 * auVar15._12_4_;
      auVar127._16_4_ = auVar169._16_4_ + fVar172 * auVar15._16_4_;
      auVar127._20_4_ = auVar169._20_4_ + fVar173 * auVar15._20_4_;
      auVar127._24_4_ = auVar169._24_4_ + fVar174 * auVar15._24_4_;
      auVar127._28_4_ = auVar169._28_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar127,auVar143);
      auVar153._0_4_ = auVar143._0_4_ + fVar221 * auVar15._0_4_;
      auVar153._4_4_ = auVar143._4_4_ + fVar222 * auVar15._4_4_;
      auVar153._8_4_ = auVar143._8_4_ + fVar145 * auVar15._8_4_;
      auVar153._12_4_ = auVar143._12_4_ + fVar171 * auVar15._12_4_;
      auVar170._16_4_ = auVar143._16_4_ + fVar172 * auVar15._16_4_;
      auVar170._0_16_ = auVar153;
      auVar170._20_4_ = auVar143._20_4_ + fVar173 * auVar15._20_4_;
      auVar170._24_4_ = auVar143._24_4_ + fVar174 * auVar15._24_4_;
      auVar170._28_4_ = auVar143._28_4_ + auVar169._28_4_;
      fVar221 = auVar15._4_4_ * 3.0;
      auVar131 = auVar170._16_16_;
      auVar113 = vshufps_avx(ZEXT416((uint)(fVar219 * 0.33333334)),
                             ZEXT416((uint)(fVar219 * 0.33333334)),0);
      auVar271._0_4_ = auVar153._0_4_ + auVar113._0_4_ * auVar15._0_4_ * 3.0;
      auVar271._4_4_ = auVar153._4_4_ + auVar113._4_4_ * fVar221;
      auVar271._8_4_ = auVar153._8_4_ + auVar113._8_4_ * auVar15._8_4_ * 3.0;
      auVar271._12_4_ = auVar153._12_4_ + auVar113._12_4_ * auVar15._12_4_ * 3.0;
      auVar214 = vshufpd_avx(auVar153,auVar153,3);
      auVar159 = vshufpd_avx(auVar131,auVar131,3);
      auVar114 = vsubps_avx(auVar214,auVar153);
      auVar204 = vsubps_avx(auVar159,auVar131);
      auVar111._0_4_ = auVar114._0_4_ + auVar204._0_4_;
      auVar111._4_4_ = auVar114._4_4_ + auVar204._4_4_;
      auVar111._8_4_ = auVar114._8_4_ + auVar204._8_4_;
      auVar111._12_4_ = auVar114._12_4_ + auVar204._12_4_;
      auVar114 = vmovshdup_avx(auVar153);
      auVar204 = vmovshdup_avx(auVar271);
      auVar158 = vshufps_avx(auVar111,auVar111,0);
      auVar92 = vshufps_avx(auVar111,auVar111,0x55);
      fVar173 = auVar92._0_4_;
      fVar174 = auVar92._4_4_;
      fVar177 = auVar92._8_4_;
      fVar190 = auVar92._12_4_;
      fVar222 = auVar158._0_4_;
      fVar145 = auVar158._4_4_;
      fVar171 = auVar158._8_4_;
      fVar172 = auVar158._12_4_;
      auVar253._0_4_ = fVar222 * auVar153._0_4_ + fVar173 * auVar114._0_4_;
      auVar253._4_4_ = fVar145 * auVar153._4_4_ + fVar174 * auVar114._4_4_;
      auVar253._8_4_ = fVar171 * auVar153._8_4_ + fVar177 * auVar114._8_4_;
      auVar253._12_4_ = fVar172 * auVar153._12_4_ + fVar190 * auVar114._12_4_;
      auVar272._0_4_ = auVar271._0_4_ * fVar222 + fVar173 * auVar204._0_4_;
      auVar272._4_4_ = auVar271._4_4_ * fVar145 + fVar174 * auVar204._4_4_;
      auVar272._8_4_ = auVar271._8_4_ * fVar171 + fVar177 * auVar204._8_4_;
      auVar272._12_4_ = auVar271._12_4_ * fVar172 + fVar190 * auVar204._12_4_;
      auVar204 = vshufps_avx(auVar253,auVar253,0xe8);
      auVar158 = vshufps_avx(auVar272,auVar272,0xe8);
      auVar114 = vcmpps_avx(auVar204,auVar158,1);
      uVar85 = vextractps_avx(auVar114,0);
      auVar92 = auVar272;
      if ((uVar85 & 1) == 0) {
        auVar92 = auVar253;
      }
      auVar112._0_4_ = auVar113._0_4_ * auVar15._16_4_ * 3.0;
      auVar112._4_4_ = auVar113._4_4_ * fVar221;
      auVar112._8_4_ = auVar113._8_4_ * auVar15._24_4_ * 3.0;
      auVar112._12_4_ = auVar113._12_4_ * auVar94._28_4_;
      auVar105 = vsubps_avx(auVar131,auVar112);
      auVar113 = vmovshdup_avx(auVar105);
      auVar131 = vmovshdup_avx(auVar131);
      fVar221 = auVar105._0_4_;
      fVar192 = auVar105._4_4_;
      auVar340._0_4_ = fVar222 * fVar221 + fVar173 * auVar113._0_4_;
      auVar340._4_4_ = fVar145 * fVar192 + fVar174 * auVar113._4_4_;
      auVar340._8_4_ = fVar171 * auVar105._8_4_ + fVar177 * auVar113._8_4_;
      auVar340._12_4_ = fVar172 * auVar105._12_4_ + fVar190 * auVar113._12_4_;
      auVar323._0_4_ = fVar222 * auVar170._16_4_ + fVar173 * auVar131._0_4_;
      auVar323._4_4_ = fVar145 * auVar170._20_4_ + fVar174 * auVar131._4_4_;
      auVar323._8_4_ = fVar171 * auVar170._24_4_ + fVar177 * auVar131._8_4_;
      auVar323._12_4_ = fVar172 * auVar170._28_4_ + fVar190 * auVar131._12_4_;
      auVar131 = vshufps_avx(auVar340,auVar340,0xe8);
      auVar90 = vshufps_avx(auVar323,auVar323,0xe8);
      auVar113 = vcmpps_avx(auVar131,auVar90,1);
      uVar85 = vextractps_avx(auVar113,0);
      auVar106 = auVar323;
      if ((uVar85 & 1) == 0) {
        auVar106 = auVar340;
      }
      auVar92 = vmaxss_avx(auVar106,auVar92);
      auVar204 = vminps_avx(auVar204,auVar158);
      auVar158 = vminps_avx(auVar131,auVar90);
      auVar158 = vminps_avx(auVar204,auVar158);
      auVar114 = vshufps_avx(auVar114,auVar114,0x55);
      auVar114 = vblendps_avx(auVar114,auVar113,2);
      auVar113 = vpslld_avx(auVar114,0x1f);
      auVar114 = vshufpd_avx(auVar272,auVar272,1);
      auVar114 = vinsertps_avx(auVar114,auVar323,0x9c);
      auVar204 = vshufpd_avx(auVar253,auVar253,1);
      auVar204 = vinsertps_avx(auVar204,auVar340,0x9c);
      auVar114 = vblendvps_avx(auVar204,auVar114,auVar113);
      auVar204 = vmovshdup_avx(auVar114);
      auVar114 = vmaxss_avx(auVar204,auVar114);
      fVar171 = auVar158._0_4_;
      auVar204 = vmovshdup_avx(auVar158);
      fVar145 = auVar114._0_4_;
      fVar172 = auVar204._0_4_;
      fVar222 = auVar92._0_4_;
      if ((0.0001 <= fVar171) || (fVar145 <= -0.0001)) {
        if ((-0.0001 < fVar222 && fVar172 < 0.0001) ||
           ((fVar171 < 0.0001 && -0.0001 < fVar222 || (fVar172 < 0.0001 && -0.0001 < fVar145))))
        goto LAB_011742f9;
LAB_01174f32:
        bVar63 = true;
        auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar345 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
      }
      else {
LAB_011742f9:
        auVar334 = ZEXT864(0) << 0x20;
        auVar113 = vcmpps_avx(auVar158,ZEXT816(0) << 0x20,1);
        auVar204 = vcmpss_avx(auVar92,ZEXT416(0),1);
        auVar341._8_4_ = 0x3f800000;
        auVar341._0_8_ = &DAT_3f8000003f800000;
        auVar341._12_4_ = 0x3f800000;
        auVar345 = ZEXT1664(auVar341);
        auVar208._8_4_ = 0xbf800000;
        auVar208._0_8_ = 0xbf800000bf800000;
        auVar208._12_4_ = 0xbf800000;
        auVar204 = vblendvps_avx(auVar341,auVar208,auVar204);
        auVar113 = vblendvps_avx(auVar341,auVar208,auVar113);
        auVar131 = vcmpss_avx(auVar204,auVar113,4);
        auVar131 = vpshufd_avx(ZEXT416(auVar131._0_4_ & 1),0x50);
        auVar131 = vpslld_avx(auVar131,0x1f);
        auVar131 = vpsrad_avx(auVar131,0x1f);
        auVar131 = vpandn_avx(auVar131,_DAT_02020eb0);
        auVar90 = vmovshdup_avx(auVar113);
        fVar173 = auVar90._0_4_;
        if ((auVar113._0_4_ != fVar173) || (NAN(auVar113._0_4_) || NAN(fVar173))) {
          if ((fVar172 != fVar171) || (NAN(fVar172) || NAN(fVar171))) {
            fVar171 = -fVar171 / (fVar172 - fVar171);
            auVar113 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar171) * 0.0 + fVar171)));
          }
          else {
            auVar113 = vcmpss_avx(auVar158,ZEXT416(0),0);
            auVar113 = vpshufd_avx(ZEXT416(auVar113._0_4_ & 1),0x50);
            auVar113 = vpslld_avx(auVar113,0x1f);
            auVar113 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar113);
          }
          auVar90 = vcmpps_avx(auVar131,auVar113,1);
          auVar158 = vblendps_avx(auVar131,auVar113,2);
          auVar113 = vblendps_avx(auVar113,auVar131,2);
          auVar131 = vblendvps_avx(auVar113,auVar158,auVar90);
        }
        auVar114 = vcmpss_avx(auVar114,ZEXT416(0),1);
        auVar132._8_4_ = 0xbf800000;
        auVar132._0_8_ = 0xbf800000bf800000;
        auVar132._12_4_ = 0xbf800000;
        auVar114 = vblendvps_avx(auVar341,auVar132,auVar114);
        fVar171 = auVar114._0_4_;
        if ((auVar204._0_4_ != fVar171) || (NAN(auVar204._0_4_) || NAN(fVar171))) {
          if ((fVar145 != fVar222) || (NAN(fVar145) || NAN(fVar222))) {
            fVar222 = -fVar222 / (fVar145 - fVar222);
            auVar114 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar222) * 0.0 + fVar222)));
          }
          else {
            auVar114 = vcmpss_avx(auVar92,ZEXT416(0),0);
            auVar114 = vpshufd_avx(ZEXT416(auVar114._0_4_ & 1),0x50);
            auVar114 = vpslld_avx(auVar114,0x1f);
            auVar114 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar114);
          }
          auVar113 = vcmpps_avx(auVar131,auVar114,1);
          auVar204 = vblendps_avx(auVar131,auVar114,2);
          auVar114 = vblendps_avx(auVar114,auVar131,2);
          auVar131 = vblendvps_avx(auVar114,auVar204,auVar113);
        }
        if ((fVar173 != fVar171) || (NAN(fVar173) || NAN(fVar171))) {
          auVar114 = vcmpps_avx(auVar131,auVar341,1);
          auVar204 = vinsertps_avx(auVar131,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar209._4_12_ = auVar131._4_12_;
          auVar209._0_4_ = 0x3f800000;
          auVar131 = vblendvps_avx(auVar209,auVar204,auVar114);
        }
        auVar114 = vcmpps_avx(auVar131,_DAT_01fec6f0,1);
        auVar65._12_4_ = 0;
        auVar65._0_12_ = auVar131._4_12_;
        auVar204 = vinsertps_avx(auVar131,ZEXT416(0x3f800000),0x10);
        auVar114 = vblendvps_avx(auVar204,auVar65 << 0x20,auVar114);
        auVar204 = vmovshdup_avx(auVar114);
        bVar63 = true;
        if (auVar114._0_4_ <= auVar204._0_4_) {
          auVar115._0_4_ = auVar114._0_4_ + -0.1;
          auVar115._4_4_ = auVar114._4_4_ + 0.1;
          auVar115._8_4_ = auVar114._8_4_ + 0.0;
          auVar115._12_4_ = auVar114._12_4_ + 0.0;
          auVar113 = vshufpd_avx(auVar271,auVar271,3);
          auVar154._8_8_ = 0x3f80000000000000;
          auVar154._0_8_ = 0x3f80000000000000;
          auVar114 = vcmpps_avx(auVar115,auVar154,1);
          auVar66._12_4_ = 0;
          auVar66._0_12_ = auVar115._4_12_;
          auVar204 = vinsertps_avx(auVar115,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar114 = vblendvps_avx(auVar204,auVar66 << 0x20,auVar114);
          auVar204 = vshufpd_avx(auVar105,auVar105,3);
          auVar158 = vshufps_avx(auVar114,auVar114,0x50);
          auVar92 = vsubps_avx(auVar341,auVar158);
          local_620 = auVar214._0_4_;
          fStack_61c = auVar214._4_4_;
          fStack_618 = auVar214._8_4_;
          fStack_614 = auVar214._12_4_;
          fVar222 = auVar158._0_4_;
          fVar145 = auVar158._4_4_;
          fVar171 = auVar158._8_4_;
          fVar172 = auVar158._12_4_;
          local_660 = auVar159._0_4_;
          fStack_65c = auVar159._4_4_;
          fStack_658 = auVar159._8_4_;
          fStack_654 = auVar159._12_4_;
          fVar173 = auVar92._0_4_;
          fVar174 = auVar92._4_4_;
          fVar177 = auVar92._8_4_;
          fVar190 = auVar92._12_4_;
          auVar133._0_4_ = fVar222 * local_620 + fVar173 * auVar153._0_4_;
          auVar133._4_4_ = fVar145 * fStack_61c + fVar174 * auVar153._4_4_;
          auVar133._8_4_ = fVar171 * fStack_618 + fVar177 * auVar153._0_4_;
          auVar133._12_4_ = fVar172 * fStack_614 + fVar190 * auVar153._4_4_;
          auVar180._0_4_ = fVar222 * auVar113._0_4_ + fVar173 * auVar271._0_4_;
          auVar180._4_4_ = fVar145 * auVar113._4_4_ + fVar174 * auVar271._4_4_;
          auVar180._8_4_ = fVar171 * auVar113._8_4_ + fVar177 * auVar271._0_4_;
          auVar180._12_4_ = fVar172 * auVar113._12_4_ + fVar190 * auVar271._4_4_;
          auVar243._0_4_ = fVar222 * auVar204._0_4_ + fVar173 * fVar221;
          auVar243._4_4_ = fVar145 * auVar204._4_4_ + fVar174 * fVar192;
          auVar243._8_4_ = fVar171 * auVar204._8_4_ + fVar177 * fVar221;
          auVar243._12_4_ = fVar172 * auVar204._12_4_ + fVar190 * fVar192;
          auVar254._0_4_ = fVar222 * local_660 + fVar173 * auVar170._16_4_;
          auVar254._4_4_ = fVar145 * fStack_65c + fVar174 * auVar170._20_4_;
          auVar254._8_4_ = fVar171 * fStack_658 + fVar177 * auVar170._16_4_;
          auVar254._12_4_ = fVar172 * fStack_654 + fVar190 * auVar170._20_4_;
          auVar159 = vsubps_avx(auVar341,auVar114);
          auVar204 = vmovshdup_avx(_local_6c0);
          auVar214 = vmovsldup_avx(_local_6c0);
          local_6c0._0_4_ = auVar159._0_4_ * auVar214._0_4_ + auVar204._0_4_ * auVar114._0_4_;
          local_6c0._4_4_ = auVar159._4_4_ * auVar214._4_4_ + auVar204._4_4_ * auVar114._4_4_;
          fStack_6b8 = auVar159._8_4_ * auVar214._8_4_ + auVar204._8_4_ * auVar114._8_4_;
          fStack_6b4 = auVar159._12_4_ * auVar214._12_4_ + auVar204._12_4_ * auVar114._12_4_;
          auVar105 = vmovshdup_avx(_local_6c0);
          auVar114 = vsubps_avx(auVar180,auVar133);
          auVar210._0_4_ = auVar114._0_4_ * 3.0;
          auVar210._4_4_ = auVar114._4_4_ * 3.0;
          auVar210._8_4_ = auVar114._8_4_ * 3.0;
          auVar210._12_4_ = auVar114._12_4_ * 3.0;
          auVar114 = vsubps_avx(auVar243,auVar180);
          auVar226._0_4_ = auVar114._0_4_ * 3.0;
          auVar226._4_4_ = auVar114._4_4_ * 3.0;
          auVar226._8_4_ = auVar114._8_4_ * 3.0;
          auVar226._12_4_ = auVar114._12_4_ * 3.0;
          auVar114 = vsubps_avx(auVar254,auVar243);
          auVar273._0_4_ = auVar114._0_4_ * 3.0;
          auVar273._4_4_ = auVar114._4_4_ * 3.0;
          auVar273._8_4_ = auVar114._8_4_ * 3.0;
          auVar273._12_4_ = auVar114._12_4_ * 3.0;
          auVar204 = vminps_avx(auVar226,auVar273);
          auVar114 = vmaxps_avx(auVar226,auVar273);
          auVar204 = vminps_avx(auVar210,auVar204);
          auVar114 = vmaxps_avx(auVar210,auVar114);
          auVar214 = vshufpd_avx(auVar204,auVar204,3);
          auVar159 = vshufpd_avx(auVar114,auVar114,3);
          auVar204 = vminps_avx(auVar204,auVar214);
          auVar114 = vmaxps_avx(auVar114,auVar159);
          auVar214 = vshufps_avx(ZEXT416((uint)(1.0 / fVar219)),ZEXT416((uint)(1.0 / fVar219)),0);
          auVar211._0_4_ = auVar214._0_4_ * auVar204._0_4_;
          auVar211._4_4_ = auVar214._4_4_ * auVar204._4_4_;
          auVar211._8_4_ = auVar214._8_4_ * auVar204._8_4_;
          auVar211._12_4_ = auVar214._12_4_ * auVar204._12_4_;
          auVar227._0_4_ = auVar114._0_4_ * auVar214._0_4_;
          auVar227._4_4_ = auVar114._4_4_ * auVar214._4_4_;
          auVar227._8_4_ = auVar114._8_4_ * auVar214._8_4_;
          auVar227._12_4_ = auVar114._12_4_ * auVar214._12_4_;
          auVar92 = ZEXT416((uint)(1.0 / (auVar105._0_4_ - (float)local_6c0._0_4_)));
          auVar114 = vshufpd_avx(auVar133,auVar133,3);
          auVar204 = vshufpd_avx(auVar180,auVar180,3);
          auVar214 = vshufpd_avx(auVar243,auVar243,3);
          auVar159 = vshufpd_avx(auVar254,auVar254,3);
          auVar114 = vsubps_avx(auVar114,auVar133);
          auVar113 = vsubps_avx(auVar204,auVar180);
          auVar158 = vsubps_avx(auVar214,auVar243);
          auVar159 = vsubps_avx(auVar159,auVar254);
          auVar204 = vminps_avx(auVar114,auVar113);
          auVar114 = vmaxps_avx(auVar114,auVar113);
          auVar214 = vminps_avx(auVar158,auVar159);
          auVar214 = vminps_avx(auVar204,auVar214);
          auVar204 = vmaxps_avx(auVar158,auVar159);
          auVar114 = vmaxps_avx(auVar114,auVar204);
          auVar204 = vshufps_avx(auVar92,auVar92,0);
          auVar284._0_4_ = auVar204._0_4_ * auVar214._0_4_;
          auVar284._4_4_ = auVar204._4_4_ * auVar214._4_4_;
          auVar284._8_4_ = auVar204._8_4_ * auVar214._8_4_;
          auVar284._12_4_ = auVar204._12_4_ * auVar214._12_4_;
          auVar294._0_4_ = auVar204._0_4_ * auVar114._0_4_;
          auVar294._4_4_ = auVar204._4_4_ * auVar114._4_4_;
          auVar294._8_4_ = auVar204._8_4_ * auVar114._8_4_;
          auVar294._12_4_ = auVar204._12_4_ * auVar114._12_4_;
          auVar114 = vmovsldup_avx(_local_6c0);
          auVar244._4_12_ = auVar114._4_12_;
          auVar244._0_4_ = fVar220;
          auVar255._4_12_ = local_6c0._4_12_;
          auVar255._0_4_ = fVar218;
          auVar93._0_4_ = (fVar218 + fVar220) * 0.5;
          auVar93._4_4_ = ((float)local_6c0._4_4_ + auVar114._4_4_) * 0.5;
          auVar93._8_4_ = (fStack_6b8 + auVar114._8_4_) * 0.5;
          auVar93._12_4_ = (fStack_6b4 + auVar114._12_4_) * 0.5;
          auVar114 = vshufps_avx(auVar93,auVar93,0);
          fVar221 = auVar114._0_4_;
          fVar222 = auVar114._4_4_;
          fVar145 = auVar114._8_4_;
          fVar171 = auVar114._12_4_;
          local_550 = auVar5._0_4_;
          fStack_54c = auVar5._4_4_;
          fStack_548 = auVar5._8_4_;
          fStack_544 = auVar5._12_4_;
          auVar181._0_4_ = fVar221 * (float)local_350._0_4_ + local_550;
          auVar181._4_4_ = fVar222 * (float)local_350._4_4_ + fStack_54c;
          auVar181._8_4_ = fVar145 * fStack_348 + fStack_548;
          auVar181._12_4_ = fVar171 * fStack_344 + fStack_544;
          local_560 = auVar293._0_4_;
          fStack_55c = auVar293._4_4_;
          fStack_558 = auVar293._8_4_;
          fStack_554 = auVar293._12_4_;
          auVar274._0_4_ = fVar221 * (float)local_360._0_4_ + local_560;
          auVar274._4_4_ = fVar222 * (float)local_360._4_4_ + fStack_55c;
          auVar274._8_4_ = fVar145 * fStack_358 + fStack_558;
          auVar274._12_4_ = fVar171 * fStack_354 + fStack_554;
          local_570 = auVar6._0_4_;
          fStack_56c = auVar6._4_4_;
          fStack_568 = auVar6._8_4_;
          fStack_564 = auVar6._12_4_;
          auVar310._0_4_ = fVar221 * (float)local_370._0_4_ + local_570;
          auVar310._4_4_ = fVar222 * (float)local_370._4_4_ + fStack_56c;
          auVar310._8_4_ = fVar145 * fStack_368 + fStack_568;
          auVar310._12_4_ = fVar171 * fStack_364 + fStack_564;
          auVar114 = vsubps_avx(auVar274,auVar181);
          auVar182._0_4_ = auVar114._0_4_ * fVar221 + auVar181._0_4_;
          auVar182._4_4_ = auVar114._4_4_ * fVar222 + auVar181._4_4_;
          auVar182._8_4_ = auVar114._8_4_ * fVar145 + auVar181._8_4_;
          auVar182._12_4_ = auVar114._12_4_ * fVar171 + auVar181._12_4_;
          auVar114 = vsubps_avx(auVar310,auVar274);
          auVar275._0_4_ = auVar274._0_4_ + auVar114._0_4_ * fVar221;
          auVar275._4_4_ = auVar274._4_4_ + auVar114._4_4_ * fVar222;
          auVar275._8_4_ = auVar274._8_4_ + auVar114._8_4_ * fVar145;
          auVar275._12_4_ = auVar274._12_4_ + auVar114._12_4_ * fVar171;
          auVar114 = vsubps_avx(auVar275,auVar182);
          fVar221 = auVar182._0_4_ + auVar114._0_4_ * fVar221;
          fVar222 = auVar182._4_4_ + auVar114._4_4_ * fVar222;
          auVar134._0_8_ = CONCAT44(fVar222,fVar221);
          auVar134._8_4_ = auVar182._8_4_ + auVar114._8_4_ * fVar145;
          auVar134._12_4_ = auVar182._12_4_ + auVar114._12_4_ * fVar171;
          fVar145 = auVar114._0_4_ * 3.0;
          fVar171 = auVar114._4_4_ * 3.0;
          auVar183._0_8_ = CONCAT44(fVar171,fVar145);
          auVar183._8_4_ = auVar114._8_4_ * 3.0;
          auVar183._12_4_ = auVar114._12_4_ * 3.0;
          auVar276._8_8_ = auVar134._0_8_;
          auVar276._0_8_ = auVar134._0_8_;
          auVar114 = vshufpd_avx(auVar134,auVar134,3);
          auVar204 = vshufps_avx(auVar93,auVar93,0x55);
          auVar158 = vsubps_avx(auVar114,auVar276);
          auVar277._0_4_ = auVar204._0_4_ * auVar158._0_4_ + fVar221;
          auVar277._4_4_ = auVar204._4_4_ * auVar158._4_4_ + fVar222;
          auVar277._8_4_ = auVar204._8_4_ * auVar158._8_4_ + fVar221;
          auVar277._12_4_ = auVar204._12_4_ * auVar158._12_4_ + fVar222;
          auVar324._8_8_ = auVar183._0_8_;
          auVar324._0_8_ = auVar183._0_8_;
          auVar114 = vshufpd_avx(auVar183,auVar183,1);
          auVar114 = vsubps_avx(auVar114,auVar324);
          auVar184._0_4_ = fVar145 + auVar204._0_4_ * auVar114._0_4_;
          auVar184._4_4_ = fVar171 + auVar204._4_4_ * auVar114._4_4_;
          auVar184._8_4_ = fVar145 + auVar204._8_4_ * auVar114._8_4_;
          auVar184._12_4_ = fVar171 + auVar204._12_4_ * auVar114._12_4_;
          auVar204 = vmovshdup_avx(auVar184);
          auVar325._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
          auVar325._8_4_ = auVar204._8_4_ ^ 0x80000000;
          auVar325._12_4_ = auVar204._12_4_ ^ 0x80000000;
          auVar214 = vmovshdup_avx(auVar158);
          auVar114 = vunpcklps_avx(auVar214,auVar325);
          auVar159 = vshufps_avx(auVar114,auVar325,4);
          auVar135._0_8_ = auVar158._0_8_ ^ 0x8000000080000000;
          auVar135._8_4_ = -auVar158._8_4_;
          auVar135._12_4_ = -auVar158._12_4_;
          auVar114 = vmovlhps_avx(auVar135,auVar184);
          auVar113 = vshufps_avx(auVar114,auVar184,8);
          auVar114 = ZEXT416((uint)(auVar214._0_4_ * auVar184._0_4_ -
                                   auVar204._0_4_ * auVar158._0_4_));
          auVar204 = vshufps_avx(auVar114,auVar114,0);
          auVar114 = vdivps_avx(auVar159,auVar204);
          auVar204 = vdivps_avx(auVar113,auVar204);
          auVar113 = vinsertps_avx(auVar211,auVar284,0x1c);
          auVar158 = vinsertps_avx(auVar227,auVar294,0x1c);
          auVar92 = vinsertps_avx(auVar284,auVar211,0x4c);
          auVar131 = vinsertps_avx(auVar294,auVar227,0x4c);
          auVar214 = vmovsldup_avx(auVar114);
          auVar295._0_4_ = auVar214._0_4_ * auVar113._0_4_;
          auVar295._4_4_ = auVar214._4_4_ * auVar113._4_4_;
          auVar295._8_4_ = auVar214._8_4_ * auVar113._8_4_;
          auVar295._12_4_ = auVar214._12_4_ * auVar113._12_4_;
          auVar285._0_4_ = auVar214._0_4_ * auVar158._0_4_;
          auVar285._4_4_ = auVar214._4_4_ * auVar158._4_4_;
          auVar285._8_4_ = auVar214._8_4_ * auVar158._8_4_;
          auVar285._12_4_ = auVar214._12_4_ * auVar158._12_4_;
          auVar159 = vminps_avx(auVar295,auVar285);
          auVar214 = vmaxps_avx(auVar285,auVar295);
          auVar90 = vmovsldup_avx(auVar204);
          auVar342._0_4_ = auVar90._0_4_ * auVar92._0_4_;
          auVar342._4_4_ = auVar90._4_4_ * auVar92._4_4_;
          auVar342._8_4_ = auVar90._8_4_ * auVar92._8_4_;
          auVar342._12_4_ = auVar90._12_4_ * auVar92._12_4_;
          auVar286._0_4_ = auVar90._0_4_ * auVar131._0_4_;
          auVar286._4_4_ = auVar90._4_4_ * auVar131._4_4_;
          auVar286._8_4_ = auVar90._8_4_ * auVar131._8_4_;
          auVar286._12_4_ = auVar90._12_4_ * auVar131._12_4_;
          auVar90 = vminps_avx(auVar342,auVar286);
          auVar116._0_4_ = auVar159._0_4_ + auVar90._0_4_;
          auVar116._4_4_ = auVar159._4_4_ + auVar90._4_4_;
          auVar116._8_4_ = auVar159._8_4_ + auVar90._8_4_;
          auVar116._12_4_ = auVar159._12_4_ + auVar90._12_4_;
          auVar159 = vmaxps_avx(auVar286,auVar342);
          auVar90 = vsubps_avx(auVar244,auVar93);
          auVar106 = vsubps_avx(auVar255,auVar93);
          auVar256._0_4_ = auVar214._0_4_ + auVar159._0_4_;
          auVar256._4_4_ = auVar214._4_4_ + auVar159._4_4_;
          auVar256._8_4_ = auVar214._8_4_ + auVar159._8_4_;
          auVar256._12_4_ = auVar214._12_4_ + auVar159._12_4_;
          auVar296._8_8_ = 0x3f800000;
          auVar296._0_8_ = 0x3f800000;
          auVar214 = vsubps_avx(auVar296,auVar256);
          auVar159 = vsubps_avx(auVar296,auVar116);
          fVar174 = auVar90._0_4_;
          auVar297._0_4_ = fVar174 * auVar214._0_4_;
          fVar177 = auVar90._4_4_;
          auVar297._4_4_ = fVar177 * auVar214._4_4_;
          fVar190 = auVar90._8_4_;
          auVar297._8_4_ = fVar190 * auVar214._8_4_;
          fVar192 = auVar90._12_4_;
          auVar297._12_4_ = fVar192 * auVar214._12_4_;
          fVar145 = auVar106._0_4_;
          auVar257._0_4_ = auVar214._0_4_ * fVar145;
          fVar171 = auVar106._4_4_;
          auVar257._4_4_ = auVar214._4_4_ * fVar171;
          fVar172 = auVar106._8_4_;
          auVar257._8_4_ = auVar214._8_4_ * fVar172;
          fVar173 = auVar106._12_4_;
          auVar257._12_4_ = auVar214._12_4_ * fVar173;
          auVar332._0_4_ = fVar174 * auVar159._0_4_;
          auVar332._4_4_ = fVar177 * auVar159._4_4_;
          auVar332._8_4_ = fVar190 * auVar159._8_4_;
          auVar332._12_4_ = fVar192 * auVar159._12_4_;
          auVar117._0_4_ = fVar145 * auVar159._0_4_;
          auVar117._4_4_ = fVar171 * auVar159._4_4_;
          auVar117._8_4_ = fVar172 * auVar159._8_4_;
          auVar117._12_4_ = fVar173 * auVar159._12_4_;
          auVar214 = vminps_avx(auVar297,auVar332);
          auVar159 = vminps_avx(auVar257,auVar117);
          auVar90 = vminps_avx(auVar214,auVar159);
          auVar214 = vmaxps_avx(auVar332,auVar297);
          auVar159 = vmaxps_avx(auVar117,auVar257);
          auVar106 = vshufps_avx(auVar93,auVar93,0x54);
          auVar159 = vmaxps_avx(auVar159,auVar214);
          auVar129 = vshufps_avx(auVar277,auVar277,0);
          auVar146 = vshufps_avx(auVar277,auVar277,0x55);
          auVar214 = vhaddps_avx(auVar90,auVar90);
          auVar159 = vhaddps_avx(auVar159,auVar159);
          auVar258._0_4_ = auVar129._0_4_ * auVar114._0_4_ + auVar146._0_4_ * auVar204._0_4_;
          auVar258._4_4_ = auVar129._4_4_ * auVar114._4_4_ + auVar146._4_4_ * auVar204._4_4_;
          auVar258._8_4_ = auVar129._8_4_ * auVar114._8_4_ + auVar146._8_4_ * auVar204._8_4_;
          auVar258._12_4_ = auVar129._12_4_ * auVar114._12_4_ + auVar146._12_4_ * auVar204._12_4_;
          auVar90 = vsubps_avx(auVar106,auVar258);
          fVar221 = auVar90._0_4_ + auVar214._0_4_;
          fVar222 = auVar90._0_4_ + auVar159._0_4_;
          auVar214 = vmaxss_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar221));
          auVar159 = vminss_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar218));
          if (auVar214._0_4_ <= auVar159._0_4_) {
            auVar214 = vmovshdup_avx(auVar114);
            auVar155._0_4_ = auVar113._0_4_ * auVar214._0_4_;
            auVar155._4_4_ = auVar113._4_4_ * auVar214._4_4_;
            auVar155._8_4_ = auVar113._8_4_ * auVar214._8_4_;
            auVar155._12_4_ = auVar113._12_4_ * auVar214._12_4_;
            auVar118._0_4_ = auVar158._0_4_ * auVar214._0_4_;
            auVar118._4_4_ = auVar158._4_4_ * auVar214._4_4_;
            auVar118._8_4_ = auVar158._8_4_ * auVar214._8_4_;
            auVar118._12_4_ = auVar158._12_4_ * auVar214._12_4_;
            auVar159 = vminps_avx(auVar155,auVar118);
            auVar214 = vmaxps_avx(auVar118,auVar155);
            auVar113 = vmovshdup_avx(auVar204);
            auVar212._0_4_ = auVar113._0_4_ * auVar92._0_4_;
            auVar212._4_4_ = auVar113._4_4_ * auVar92._4_4_;
            auVar212._8_4_ = auVar113._8_4_ * auVar92._8_4_;
            auVar212._12_4_ = auVar113._12_4_ * auVar92._12_4_;
            auVar156._0_4_ = auVar113._0_4_ * auVar131._0_4_;
            auVar156._4_4_ = auVar113._4_4_ * auVar131._4_4_;
            auVar156._8_4_ = auVar113._8_4_ * auVar131._8_4_;
            auVar156._12_4_ = auVar113._12_4_ * auVar131._12_4_;
            auVar113 = vminps_avx(auVar212,auVar156);
            auVar228._0_4_ = auVar159._0_4_ + auVar113._0_4_;
            auVar228._4_4_ = auVar159._4_4_ + auVar113._4_4_;
            auVar228._8_4_ = auVar159._8_4_ + auVar113._8_4_;
            auVar228._12_4_ = auVar159._12_4_ + auVar113._12_4_;
            auVar159 = vmaxps_avx(auVar156,auVar212);
            auVar119._0_4_ = auVar214._0_4_ + auVar159._0_4_;
            auVar119._4_4_ = auVar214._4_4_ + auVar159._4_4_;
            auVar119._8_4_ = auVar214._8_4_ + auVar159._8_4_;
            auVar119._12_4_ = auVar214._12_4_ + auVar159._12_4_;
            auVar214 = vsubps_avx(auVar154,auVar119);
            auVar159 = vsubps_avx(auVar154,auVar228);
            auVar213._0_4_ = fVar174 * auVar214._0_4_;
            auVar213._4_4_ = fVar177 * auVar214._4_4_;
            auVar213._8_4_ = fVar190 * auVar214._8_4_;
            auVar213._12_4_ = fVar192 * auVar214._12_4_;
            auVar229._0_4_ = fVar174 * auVar159._0_4_;
            auVar229._4_4_ = fVar177 * auVar159._4_4_;
            auVar229._8_4_ = fVar190 * auVar159._8_4_;
            auVar229._12_4_ = fVar192 * auVar159._12_4_;
            auVar120._0_4_ = fVar145 * auVar214._0_4_;
            auVar120._4_4_ = fVar171 * auVar214._4_4_;
            auVar120._8_4_ = fVar172 * auVar214._8_4_;
            auVar120._12_4_ = fVar173 * auVar214._12_4_;
            auVar157._0_4_ = fVar145 * auVar159._0_4_;
            auVar157._4_4_ = fVar171 * auVar159._4_4_;
            auVar157._8_4_ = fVar172 * auVar159._8_4_;
            auVar157._12_4_ = fVar173 * auVar159._12_4_;
            auVar214 = vminps_avx(auVar213,auVar229);
            auVar159 = vminps_avx(auVar120,auVar157);
            auVar214 = vminps_avx(auVar214,auVar159);
            auVar159 = vmaxps_avx(auVar229,auVar213);
            auVar113 = vmaxps_avx(auVar157,auVar120);
            auVar214 = vhaddps_avx(auVar214,auVar214);
            auVar159 = vmaxps_avx(auVar113,auVar159);
            auVar159 = vhaddps_avx(auVar159,auVar159);
            auVar113 = vmovshdup_avx(auVar90);
            auVar158 = ZEXT416((uint)(auVar113._0_4_ + auVar214._0_4_));
            auVar214 = vmaxss_avx(_local_6c0,auVar158);
            auVar113 = ZEXT416((uint)(auVar113._0_4_ + auVar159._0_4_));
            auVar159 = vminss_avx(auVar113,auVar105);
            if (auVar214._0_4_ <= auVar159._0_4_) {
              uVar85 = 0;
              auVar334 = ZEXT864(0) << 0x20;
              auVar343._8_4_ = 0x3f800000;
              auVar343._0_8_ = &DAT_3f8000003f800000;
              auVar343._12_4_ = 0x3f800000;
              auVar345 = ZEXT1664(auVar343);
              if (fVar221 <= fVar220) {
                auVar259._8_4_ = 0x7fffffff;
                auVar259._0_8_ = 0x7fffffff7fffffff;
                auVar259._12_4_ = 0x7fffffff;
              }
              else {
                auVar259._8_4_ = 0x7fffffff;
                auVar259._0_8_ = 0x7fffffff7fffffff;
                auVar259._12_4_ = 0x7fffffff;
                uVar85 = 0;
                if (fVar222 < fVar218) {
                  auVar214 = vcmpps_avx(auVar113,auVar105,1);
                  auVar159 = vcmpps_avx(_local_6c0,auVar158,1);
                  auVar214 = vandps_avx(auVar159,auVar214);
                  uVar85 = auVar214._0_4_;
                }
              }
              if (((uint)uVar87 < 4 && 0.001 <= fVar219) && (uVar85 & 1) == 0) {
                bVar63 = false;
              }
              else {
                lVar82 = 200;
                do {
                  fVar221 = auVar90._0_4_;
                  fVar219 = 1.0 - fVar221;
                  auVar214 = ZEXT416((uint)(fVar219 * fVar219 * fVar219));
                  auVar214 = vshufps_avx(auVar214,auVar214,0);
                  auVar159 = ZEXT416((uint)(fVar221 * 3.0 * fVar219 * fVar219));
                  auVar159 = vshufps_avx(auVar159,auVar159,0);
                  auVar113 = ZEXT416((uint)(fVar219 * fVar221 * fVar221 * 3.0));
                  auVar113 = vshufps_avx(auVar113,auVar113,0);
                  auVar158 = ZEXT416((uint)(fVar221 * fVar221 * fVar221));
                  auVar158 = vshufps_avx(auVar158,auVar158,0);
                  local_540 = auVar7._0_4_;
                  fStack_53c = auVar7._4_4_;
                  fStack_538 = auVar7._8_4_;
                  fStack_534 = auVar7._12_4_;
                  fVar219 = local_550 * auVar214._0_4_ +
                            local_560 * auVar159._0_4_ +
                            auVar158._0_4_ * local_540 + local_570 * auVar113._0_4_;
                  fVar221 = fStack_54c * auVar214._4_4_ +
                            fStack_55c * auVar159._4_4_ +
                            auVar158._4_4_ * fStack_53c + fStack_56c * auVar113._4_4_;
                  auVar121._0_8_ = CONCAT44(fVar221,fVar219);
                  auVar121._8_4_ =
                       fStack_548 * auVar214._8_4_ +
                       fStack_558 * auVar159._8_4_ +
                       auVar158._8_4_ * fStack_538 + fStack_568 * auVar113._8_4_;
                  auVar121._12_4_ =
                       fStack_544 * auVar214._12_4_ +
                       fStack_554 * auVar159._12_4_ +
                       auVar158._12_4_ * fStack_534 + fStack_564 * auVar113._12_4_;
                  auVar160._8_8_ = auVar121._0_8_;
                  auVar160._0_8_ = auVar121._0_8_;
                  auVar159 = vshufpd_avx(auVar121,auVar121,1);
                  auVar214 = vmovshdup_avx(auVar90);
                  auVar159 = vsubps_avx(auVar159,auVar160);
                  auVar122._0_4_ = auVar214._0_4_ * auVar159._0_4_ + fVar219;
                  auVar122._4_4_ = auVar214._4_4_ * auVar159._4_4_ + fVar221;
                  auVar122._8_4_ = auVar214._8_4_ * auVar159._8_4_ + fVar219;
                  auVar122._12_4_ = auVar214._12_4_ * auVar159._12_4_ + fVar221;
                  auVar214 = vshufps_avx(auVar122,auVar122,0);
                  auVar159 = vshufps_avx(auVar122,auVar122,0x55);
                  auVar161._0_4_ = auVar114._0_4_ * auVar214._0_4_ + auVar204._0_4_ * auVar159._0_4_
                  ;
                  auVar161._4_4_ = auVar114._4_4_ * auVar214._4_4_ + auVar204._4_4_ * auVar159._4_4_
                  ;
                  auVar161._8_4_ = auVar114._8_4_ * auVar214._8_4_ + auVar204._8_4_ * auVar159._8_4_
                  ;
                  auVar161._12_4_ =
                       auVar114._12_4_ * auVar214._12_4_ + auVar204._12_4_ * auVar159._12_4_;
                  auVar90 = vsubps_avx(auVar90,auVar161);
                  auVar214 = vandps_avx(auVar259,auVar122);
                  auVar159 = vshufps_avx(auVar214,auVar214,0xf5);
                  auVar214 = vmaxss_avx(auVar159,auVar214);
                  if (auVar214._0_4_ < fVar217) {
                    fVar219 = auVar90._0_4_;
                    if ((0.0 <= fVar219) && (fVar219 <= 1.0)) {
                      auVar114 = vmovshdup_avx(auVar90);
                      fVar221 = auVar114._0_4_;
                      if ((0.0 <= fVar221) && (fVar221 <= 1.0)) {
                        auVar114 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar131 = vinsertps_avx(auVar114,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar114 = vdpps_avx(auVar131,local_380,0x7f);
                        auVar204 = vdpps_avx(auVar131,local_390,0x7f);
                        auVar214 = vdpps_avx(auVar131,local_3c0,0x7f);
                        auVar159 = vdpps_avx(auVar131,local_3d0,0x7f);
                        auVar113 = vdpps_avx(auVar131,local_3e0,0x7f);
                        auVar158 = vdpps_avx(auVar131,local_3f0,0x7f);
                        fVar173 = 1.0 - fVar221;
                        auVar92 = vdpps_avx(auVar131,local_3a0,0x7f);
                        auVar131 = vdpps_avx(auVar131,local_3b0,0x7f);
                        fVar174 = 1.0 - fVar219;
                        fVar222 = auVar90._4_4_;
                        fVar145 = auVar90._8_4_;
                        fVar171 = auVar90._12_4_;
                        fVar172 = fVar174 * fVar219 * fVar219 * 3.0;
                        auVar215._0_4_ = fVar219 * fVar219 * fVar219;
                        auVar215._4_4_ = fVar222 * fVar222 * fVar222;
                        auVar215._8_4_ = fVar145 * fVar145 * fVar145;
                        auVar215._12_4_ = fVar171 * fVar171 * fVar171;
                        fVar222 = fVar219 * 3.0 * fVar174 * fVar174;
                        fVar145 = fVar174 * fVar174 * fVar174;
                        fVar219 = (fVar173 * auVar114._0_4_ + fVar221 * auVar214._0_4_) * fVar145 +
                                  (fVar173 * auVar204._0_4_ + fVar221 * auVar159._0_4_) * fVar222 +
                                  fVar172 * (fVar173 * auVar92._0_4_ + fVar221 * auVar113._0_4_) +
                                  auVar215._0_4_ *
                                  (auVar158._0_4_ * fVar221 + fVar173 * auVar131._0_4_);
                        if ((fVar198 <= fVar219) &&
                           (fVar221 = *(float *)(ray + k * 4 + 0x100), fVar219 <= fVar221)) {
                          pGVar9 = (context->scene->geometries).items[uVar80].ptr;
                          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar89 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar89 = true,
                                  pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_f0 = vshufps_avx(auVar90,auVar90,0x55);
                            auVar114 = vsubps_avx(auVar343,local_f0);
                            fVar171 = local_f0._0_4_;
                            fVar173 = local_f0._4_4_;
                            fVar177 = local_f0._8_4_;
                            fVar190 = local_f0._12_4_;
                            fVar192 = auVar114._0_4_;
                            fVar193 = auVar114._4_4_;
                            fVar195 = auVar114._8_4_;
                            fVar196 = auVar114._12_4_;
                            auVar278._0_4_ =
                                 fVar171 * (float)local_4b0._0_4_ + fVar192 * (float)local_4a0._0_4_
                            ;
                            auVar278._4_4_ =
                                 fVar173 * (float)local_4b0._4_4_ + fVar193 * (float)local_4a0._4_4_
                            ;
                            auVar278._8_4_ = fVar177 * fStack_4a8 + fVar195 * fStack_498;
                            auVar278._12_4_ = fVar190 * fStack_4a4 + fVar196 * fStack_494;
                            auVar287._0_4_ =
                                 fVar171 * (float)local_4f0._0_4_ + fVar192 * (float)local_4d0._0_4_
                            ;
                            auVar287._4_4_ =
                                 fVar173 * (float)local_4f0._4_4_ + fVar193 * (float)local_4d0._4_4_
                            ;
                            auVar287._8_4_ = fVar177 * fStack_4e8 + fVar195 * fStack_4c8;
                            auVar287._12_4_ = fVar190 * fStack_4e4 + fVar196 * fStack_4c4;
                            auVar298._0_4_ =
                                 fVar171 * (float)local_500._0_4_ + fVar192 * (float)local_4e0._0_4_
                            ;
                            auVar298._4_4_ =
                                 fVar173 * (float)local_500._4_4_ + fVar193 * (float)local_4e0._4_4_
                            ;
                            auVar298._8_4_ = fVar177 * fStack_4f8 + fVar195 * fStack_4d8;
                            auVar298._12_4_ = fVar190 * fStack_4f4 + fVar196 * fStack_4d4;
                            auVar260._0_4_ =
                                 fVar171 * (float)local_680._0_4_ + fVar192 * (float)local_4c0._0_4_
                            ;
                            auVar260._4_4_ =
                                 fVar173 * (float)local_680._4_4_ + fVar193 * (float)local_4c0._4_4_
                            ;
                            auVar260._8_4_ = fVar177 * fStack_678 + fVar195 * fStack_4b8;
                            auVar260._12_4_ = fVar190 * fStack_674 + fVar196 * fStack_4b4;
                            auVar159 = vsubps_avx(auVar287,auVar278);
                            auVar113 = vsubps_avx(auVar298,auVar287);
                            auVar158 = vsubps_avx(auVar260,auVar298);
                            local_110 = vshufps_avx(auVar90,auVar90,0);
                            fVar171 = local_110._0_4_;
                            fVar177 = local_110._4_4_;
                            fVar190 = local_110._8_4_;
                            fVar193 = local_110._12_4_;
                            auVar114 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
                            fVar173 = auVar114._0_4_;
                            fVar174 = auVar114._4_4_;
                            fVar192 = auVar114._8_4_;
                            fVar195 = auVar114._12_4_;
                            auVar114 = vshufps_avx(auVar215,auVar215,0);
                            auVar204 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
                            auVar214 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                            auVar185._0_4_ =
                                 ((auVar113._0_4_ * fVar173 + auVar158._0_4_ * fVar171) * fVar171 +
                                 (auVar159._0_4_ * fVar173 + auVar113._0_4_ * fVar171) * fVar173) *
                                 3.0;
                            auVar185._4_4_ =
                                 ((auVar113._4_4_ * fVar174 + auVar158._4_4_ * fVar177) * fVar177 +
                                 (auVar159._4_4_ * fVar174 + auVar113._4_4_ * fVar177) * fVar174) *
                                 3.0;
                            auVar185._8_4_ =
                                 ((auVar113._8_4_ * fVar192 + auVar158._8_4_ * fVar190) * fVar190 +
                                 (auVar159._8_4_ * fVar192 + auVar113._8_4_ * fVar190) * fVar192) *
                                 3.0;
                            auVar185._12_4_ =
                                 ((auVar113._12_4_ * fVar195 + auVar158._12_4_ * fVar193) * fVar193
                                 + (auVar159._12_4_ * fVar195 + auVar113._12_4_ * fVar193) * fVar195
                                 ) * 3.0;
                            auVar159 = vshufps_avx(ZEXT416((uint)fVar145),ZEXT416((uint)fVar145),0);
                            auVar136._0_4_ =
                                 auVar159._0_4_ * (float)local_410._0_4_ +
                                 auVar214._0_4_ * (float)local_420._0_4_ +
                                 auVar114._0_4_ * (float)local_440._0_4_ +
                                 auVar204._0_4_ * (float)local_430._0_4_;
                            auVar136._4_4_ =
                                 auVar159._4_4_ * (float)local_410._4_4_ +
                                 auVar214._4_4_ * (float)local_420._4_4_ +
                                 auVar114._4_4_ * (float)local_440._4_4_ +
                                 auVar204._4_4_ * (float)local_430._4_4_;
                            auVar136._8_4_ =
                                 auVar159._8_4_ * fStack_408 +
                                 auVar214._8_4_ * fStack_418 +
                                 auVar114._8_4_ * fStack_438 + auVar204._8_4_ * fStack_428;
                            auVar136._12_4_ =
                                 auVar159._12_4_ * fStack_404 +
                                 auVar214._12_4_ * fStack_414 +
                                 auVar114._12_4_ * fStack_434 + auVar204._12_4_ * fStack_424;
                            auVar114 = vshufps_avx(auVar185,auVar185,0xc9);
                            auVar162._0_4_ = auVar136._0_4_ * auVar114._0_4_;
                            auVar162._4_4_ = auVar136._4_4_ * auVar114._4_4_;
                            auVar162._8_4_ = auVar136._8_4_ * auVar114._8_4_;
                            auVar162._12_4_ = auVar136._12_4_ * auVar114._12_4_;
                            auVar114 = vshufps_avx(auVar136,auVar136,0xc9);
                            auVar137._0_4_ = auVar185._0_4_ * auVar114._0_4_;
                            auVar137._4_4_ = auVar185._4_4_ * auVar114._4_4_;
                            auVar137._8_4_ = auVar185._8_4_ * auVar114._8_4_;
                            auVar137._12_4_ = auVar185._12_4_ * auVar114._12_4_;
                            auVar114 = vsubps_avx(auVar137,auVar162);
                            local_170 = vshufps_avx(auVar114,auVar114,0x55);
                            local_180[0] = (RTCHitN)local_170[0];
                            local_180[1] = (RTCHitN)local_170[1];
                            local_180[2] = (RTCHitN)local_170[2];
                            local_180[3] = (RTCHitN)local_170[3];
                            local_180[4] = (RTCHitN)local_170[4];
                            local_180[5] = (RTCHitN)local_170[5];
                            local_180[6] = (RTCHitN)local_170[6];
                            local_180[7] = (RTCHitN)local_170[7];
                            local_180[8] = (RTCHitN)local_170[8];
                            local_180[9] = (RTCHitN)local_170[9];
                            local_180[10] = (RTCHitN)local_170[10];
                            local_180[0xb] = (RTCHitN)local_170[0xb];
                            local_180[0xc] = (RTCHitN)local_170[0xc];
                            local_180[0xd] = (RTCHitN)local_170[0xd];
                            local_180[0xe] = (RTCHitN)local_170[0xe];
                            local_180[0xf] = (RTCHitN)local_170[0xf];
                            local_150 = vshufps_avx(auVar114,auVar114,0xaa);
                            local_160 = local_150;
                            local_130 = vshufps_avx(auVar114,auVar114,0);
                            local_140 = local_130;
                            local_120 = local_110;
                            local_100 = local_f0;
                            local_e0 = local_300._0_8_;
                            uStack_d8 = local_300._8_8_;
                            uStack_d0 = local_300._16_8_;
                            uStack_c8 = local_300._24_8_;
                            local_c0 = local_2e0._0_8_;
                            uStack_b8 = local_2e0._8_8_;
                            uStack_b0 = local_2e0._16_8_;
                            uStack_a8 = local_2e0._24_8_;
                            auVar94 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar94._28_4_;
                            uVar85 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar219;
                            local_510 = *(undefined8 *)(mm_lookupmask_ps + lVar86);
                            uStack_508 = *(undefined8 *)(mm_lookupmask_ps + lVar86 + 8);
                            local_520 = *(undefined8 *)(mm_lookupmask_ps + uVar81);
                            uStack_518 = *(undefined8 *)(mm_lookupmask_ps + uVar81 + 8);
                            local_470.valid = (int *)&local_520;
                            local_470.geometryUserPtr = pGVar9->userPtr;
                            local_470.context = context->user;
                            local_470.ray = (RTCRayN *)ray;
                            local_470.hit = local_180;
                            local_470.N = 8;
                            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar9->occlusionFilterN)(&local_470);
                              auVar345 = ZEXT1664(CONCAT412(0x3f800000,
                                                            CONCAT48(0x3f800000,
                                                                     &DAT_3f8000003f800000)));
                              auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar75._8_8_ = uStack_518;
                            auVar75._0_8_ = local_520;
                            auVar114 = vpcmpeqd_avx(auVar334._0_16_,auVar75);
                            auVar77._8_8_ = uStack_508;
                            auVar77._0_8_ = local_510;
                            auVar204 = vpcmpeqd_avx(auVar334._0_16_,auVar77);
                            auVar102._16_16_ = auVar204;
                            auVar102._0_16_ = auVar114;
                            auVar15 = auVar94 & ~auVar102;
                            if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar15 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar15 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar15 >> 0x7f,0) == '\0') &&
                                  (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar15 >> 0xbf,0) == '\0') &&
                                (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar15[0x1f]) {
                              auVar103._0_4_ = auVar114._0_4_ ^ auVar94._0_4_;
                              auVar103._4_4_ = auVar114._4_4_ ^ auVar94._4_4_;
                              auVar103._8_4_ = auVar114._8_4_ ^ auVar94._8_4_;
                              auVar103._12_4_ = auVar114._12_4_ ^ auVar94._12_4_;
                              auVar103._16_4_ = auVar204._0_4_ ^ auVar94._16_4_;
                              auVar103._20_4_ = auVar204._4_4_ ^ auVar94._20_4_;
                              auVar103._24_4_ = auVar204._8_4_ ^ auVar94._24_4_;
                              auVar103._28_4_ = auVar204._12_4_ ^ uVar85;
                            }
                            else {
                              p_Var10 = context->args->filter;
                              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var10)(&local_470);
                                auVar345 = ZEXT1664(CONCAT412(0x3f800000,
                                                              CONCAT48(0x3f800000,
                                                                       &DAT_3f8000003f800000)));
                                auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar76._8_8_ = uStack_518;
                              auVar76._0_8_ = local_520;
                              auVar114 = vpcmpeqd_avx(auVar334._0_16_,auVar76);
                              auVar78._8_8_ = uStack_508;
                              auVar78._0_8_ = local_510;
                              auVar204 = vpcmpeqd_avx(auVar334._0_16_,auVar78);
                              auVar128._16_16_ = auVar204;
                              auVar128._0_16_ = auVar114;
                              auVar103._0_4_ = auVar114._0_4_ ^ auVar94._0_4_;
                              auVar103._4_4_ = auVar114._4_4_ ^ auVar94._4_4_;
                              auVar103._8_4_ = auVar114._8_4_ ^ auVar94._8_4_;
                              auVar103._12_4_ = auVar114._12_4_ ^ auVar94._12_4_;
                              auVar103._16_4_ = auVar204._0_4_ ^ auVar94._16_4_;
                              auVar103._20_4_ = auVar204._4_4_ ^ auVar94._20_4_;
                              auVar103._24_4_ = auVar204._8_4_ ^ auVar94._24_4_;
                              auVar103._28_4_ = auVar204._12_4_ ^ uVar85;
                              auVar144._8_4_ = 0xff800000;
                              auVar144._0_8_ = 0xff800000ff800000;
                              auVar144._12_4_ = 0xff800000;
                              auVar144._16_4_ = 0xff800000;
                              auVar144._20_4_ = 0xff800000;
                              auVar144._24_4_ = 0xff800000;
                              auVar144._28_4_ = 0xff800000;
                              auVar94 = vblendvps_avx(auVar144,*(undefined1 (*) [32])
                                                                (local_470.ray + 0x100),auVar128);
                              *(undefined1 (*) [32])(local_470.ray + 0x100) = auVar94;
                            }
                            bVar71 = (auVar103 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar72 = (auVar103 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar70 = (auVar103 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar69 = SUB321(auVar103 >> 0x7f,0) != '\0';
                            bVar68 = (auVar103 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar67 = SUB321(auVar103 >> 0xbf,0) != '\0';
                            bVar64 = (auVar103 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar89 = auVar103[0x1f] < '\0';
                            if (((((((!bVar71 && !bVar72) && !bVar70) && !bVar69) && !bVar68) &&
                                 !bVar67) && !bVar64) && !bVar89) {
                              *(float *)(ray + k * 4 + 0x100) = fVar221;
                            }
                            bVar89 = ((((((bVar71 || bVar72) || bVar70) || bVar69) || bVar68) ||
                                      bVar67) || bVar64) || bVar89;
                          }
                          bVar79 = (bool)(bVar79 | bVar89);
                        }
                      }
                    }
                    break;
                  }
                  lVar82 = lVar82 + -1;
                } while (lVar82 != 0);
              }
              goto LAB_01174b93;
            }
          }
          goto LAB_01174f32;
        }
      }
LAB_01174b93:
    } while (bVar63);
    local_400 = vinsertps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar218),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }